

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::SubGridMBIntersector1Pluecker<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  uint uVar59;
  int iVar60;
  AABBNodeMB4D *node1;
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  long lVar64;
  Ray *pRVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong unaff_R12;
  size_t mask;
  ulong uVar74;
  long lVar75;
  ulong uVar76;
  ulong *puVar77;
  bool bVar78;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar79;
  float fVar80;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar94;
  undefined1 auVar89 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar107 [32];
  float fVar110;
  float fVar111;
  undefined1 auVar108 [64];
  float fVar109;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar137;
  undefined1 auVar128 [16];
  undefined1 auVar135 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar136 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar154;
  float fVar155;
  undefined1 auVar153 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar156 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar157 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar191;
  float fVar193;
  float fVar195;
  undefined1 auVar182 [32];
  float fVar184;
  float fVar186;
  float fVar190;
  float fVar192;
  float fVar194;
  undefined1 auVar183 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar196;
  float fVar197;
  undefined1 auVar198 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar199 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar200 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar222;
  float fVar224;
  undefined1 auVar211 [32];
  float fVar213;
  float fVar215;
  float fVar219;
  float fVar221;
  float fVar223;
  undefined1 auVar212 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  float fVar236;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar242 [64];
  undefined1 auVar249 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  float fVar262;
  undefined1 auVar263 [32];
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [64];
  float fVar271;
  float fVar272;
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar275 [64];
  float fVar286;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar288 [64];
  float fVar301;
  float fVar302;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar303 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [564];
  undefined1 local_1819;
  ulong local_1818;
  ulong local_1810;
  ulong local_1808;
  ulong local_1800;
  ulong local_17f8;
  ulong local_17f0;
  RayQueryContext *local_17e8;
  uint local_17dc;
  uint local_17d8;
  int local_17d4;
  ulong local_17d0;
  ulong *local_17c8;
  undefined8 local_17c0;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  undefined1 local_17a0 [8];
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined8 local_1780;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  undefined1 local_1750 [16];
  undefined1 local_1740 [32];
  ulong local_1720;
  long local_1718;
  Ray *local_1710;
  ulong local_1708;
  ulong local_1700;
  long local_16f8;
  long local_16f0;
  Scene *local_16e8;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  float local_1660;
  float local_165c;
  float local_1658;
  undefined4 local_1654;
  uint local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 local_1644;
  undefined4 local_1640;
  int *local_1630;
  undefined8 local_1628;
  undefined4 *local_1620;
  Ray *local_1618;
  float *local_1610;
  undefined4 local_1608;
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  undefined1 local_1560 [8];
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar80 = ray->tfar;
    if (0.0 <= fVar80) {
      puVar77 = local_11f8;
      aVar4 = (ray->dir).field_0;
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar81 = vandps_avx((undefined1  [16])aVar4,auVar81);
      auVar128._8_4_ = 0x219392ef;
      auVar128._0_8_ = 0x219392ef219392ef;
      auVar128._12_4_ = 0x219392ef;
      auVar81 = vcmpps_avx(auVar81,auVar128,1);
      auVar141._8_4_ = 0x3f800000;
      auVar141._0_8_ = &DAT_3f8000003f800000;
      auVar141._12_4_ = 0x3f800000;
      auVar128 = vdivps_avx(auVar141,(undefined1  [16])aVar4);
      auVar84._8_4_ = 0x5d5e0b6b;
      auVar84._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar84._12_4_ = 0x5d5e0b6b;
      auVar81 = vblendvps_avx(auVar128,auVar84,auVar81);
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar123._0_4_ = auVar81._0_4_ * 0.99999964;
      auVar123._4_4_ = auVar81._4_4_ * 0.99999964;
      auVar123._8_4_ = auVar81._8_4_ * 0.99999964;
      auVar123._12_4_ = auVar81._12_4_ * 0.99999964;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_1600._4_4_ = uVar3;
      local_1600._0_4_ = uVar3;
      local_1600._8_4_ = uVar3;
      local_1600._12_4_ = uVar3;
      local_1600._16_4_ = uVar3;
      local_1600._20_4_ = uVar3;
      local_1600._24_4_ = uVar3;
      local_1600._28_4_ = uVar3;
      auVar303 = ZEXT3264(local_1600);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1680._4_4_ = uVar3;
      local_1680._0_4_ = uVar3;
      local_1680._8_4_ = uVar3;
      local_1680._12_4_ = uVar3;
      local_1680._16_4_ = uVar3;
      local_1680._20_4_ = uVar3;
      local_1680._24_4_ = uVar3;
      local_1680._28_4_ = uVar3;
      auVar275 = ZEXT3264(local_1680);
      auVar112._0_4_ = auVar81._0_4_ * 1.0000004;
      auVar112._4_4_ = auVar81._4_4_ * 1.0000004;
      auVar112._8_4_ = auVar81._8_4_ * 1.0000004;
      auVar112._12_4_ = auVar81._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_14e0._4_4_ = uVar3;
      local_14e0._0_4_ = uVar3;
      local_14e0._8_4_ = uVar3;
      local_14e0._12_4_ = uVar3;
      local_14e0._16_4_ = uVar3;
      local_14e0._20_4_ = uVar3;
      local_14e0._24_4_ = uVar3;
      local_14e0._28_4_ = uVar3;
      auVar183 = ZEXT3264(local_14e0);
      auVar81 = vshufps_avx(auVar123,auVar123,0);
      register0x000013d0 = auVar81;
      _local_1540 = auVar81;
      auVar212 = ZEXT3264(_local_1540);
      auVar81 = vmovshdup_avx(auVar123);
      auVar153 = ZEXT1664(auVar81);
      auVar128 = vshufps_avx(auVar123,auVar123,0x55);
      register0x00001410 = auVar128;
      _local_1560 = auVar128;
      auVar235 = ZEXT3264(_local_1560);
      auVar128 = vshufpd_avx(auVar123,auVar123,1);
      auVar141 = vshufps_avx(auVar123,auVar123,0xaa);
      register0x00001450 = auVar141;
      _local_1580 = auVar141;
      auVar242 = ZEXT3264(_local_1580);
      auVar141 = vshufps_avx(auVar112,auVar112,0);
      local_1500._16_16_ = auVar141;
      local_1500._0_16_ = auVar141;
      auVar256 = ZEXT3264(local_1500);
      auVar141 = vshufps_avx(auVar112,auVar112,0x55);
      auVar136 = ZEXT1664(auVar141);
      local_1520._16_16_ = auVar141;
      local_1520._0_16_ = auVar141;
      auVar261 = ZEXT3264(local_1520);
      auVar141 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar121 = ZEXT1664(auVar141);
      uVar74 = (ulong)(auVar123._0_4_ < 0.0) << 5;
      local_16a0._16_16_ = auVar141;
      local_16a0._0_16_ = auVar141;
      auVar288 = ZEXT3264(local_16a0);
      uVar68 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x40;
      uVar69 = (ulong)(auVar128._0_4_ < 0.0) << 5 | 0x80;
      uVar71 = uVar74 ^ 0x20;
      uVar72 = uVar68 ^ 0x20;
      uVar73 = uVar69 ^ 0x20;
      auVar81 = vshufps_avx(auVar82,auVar82,0);
      local_1420 = ZEXT1632(auVar81);
      local_16c0._16_16_ = auVar81;
      local_16c0._0_16_ = auVar81;
      auVar264 = ZEXT3264(local_16c0);
      auVar81 = vshufps_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),0);
      local_14a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_14a0._0_16_ = mm_lookupmask_ps._240_16_;
      local_1460 = vperm2f128_avx(local_14a0,mm_lookupmask_ps._0_32_,2);
      auVar108 = ZEXT3264(local_1460);
      local_1440 = ZEXT1632(auVar81);
      local_15c0._16_16_ = auVar81;
      local_15c0._0_16_ = auVar81;
      auVar171 = ZEXT3264(local_15c0);
      local_1710 = ray;
      local_17d0 = uVar74;
      local_1810 = uVar73;
      local_1808 = uVar72;
      local_1800 = uVar71;
      local_17f8 = uVar69;
      local_17f0 = uVar68;
      local_17e8 = context;
      do {
        if (puVar77 == &local_1200) {
          return;
        }
        uVar76 = puVar77[-1];
        puVar77 = puVar77 + -1;
        do {
          if ((uVar76 & 8) == 0) {
            uVar61 = uVar76 & 0xfffffffffffffff0;
            fVar80 = (ray->dir).field_0.m128[3];
            auVar86._4_4_ = fVar80;
            auVar86._0_4_ = fVar80;
            auVar86._8_4_ = fVar80;
            auVar86._12_4_ = fVar80;
            auVar86._16_4_ = fVar80;
            auVar86._20_4_ = fVar80;
            auVar86._24_4_ = fVar80;
            auVar86._28_4_ = fVar80;
            pfVar2 = (float *)(uVar61 + 0x100 + uVar74);
            pfVar1 = (float *)(uVar61 + 0x40 + uVar74);
            auVar104._0_4_ = fVar80 * *pfVar2 + *pfVar1;
            auVar104._4_4_ = fVar80 * pfVar2[1] + pfVar1[1];
            auVar104._8_4_ = fVar80 * pfVar2[2] + pfVar1[2];
            auVar104._12_4_ = fVar80 * pfVar2[3] + pfVar1[3];
            auVar104._16_4_ = fVar80 * pfVar2[4] + pfVar1[4];
            auVar104._20_4_ = fVar80 * pfVar2[5] + pfVar1[5];
            auVar104._24_4_ = fVar80 * pfVar2[6] + pfVar1[6];
            auVar104._28_4_ = auVar108._28_4_ + pfVar1[7];
            auVar104 = vsubps_avx(auVar104,auVar303._0_32_);
            auVar12._4_4_ = auVar212._4_4_ * auVar104._4_4_;
            auVar12._0_4_ = auVar212._0_4_ * auVar104._0_4_;
            auVar12._8_4_ = auVar212._8_4_ * auVar104._8_4_;
            auVar12._12_4_ = auVar212._12_4_ * auVar104._12_4_;
            auVar12._16_4_ = auVar212._16_4_ * auVar104._16_4_;
            auVar12._20_4_ = auVar212._20_4_ * auVar104._20_4_;
            auVar12._24_4_ = auVar212._24_4_ * auVar104._24_4_;
            auVar12._28_4_ = auVar104._28_4_;
            pfVar2 = (float *)(uVar61 + 0x100 + uVar68);
            pfVar1 = (float *)(uVar61 + 0x40 + uVar68);
            auVar115._0_4_ = fVar80 * *pfVar2 + *pfVar1;
            auVar115._4_4_ = fVar80 * pfVar2[1] + pfVar1[1];
            auVar115._8_4_ = fVar80 * pfVar2[2] + pfVar1[2];
            auVar115._12_4_ = fVar80 * pfVar2[3] + pfVar1[3];
            auVar115._16_4_ = fVar80 * pfVar2[4] + pfVar1[4];
            auVar115._20_4_ = fVar80 * pfVar2[5] + pfVar1[5];
            auVar115._24_4_ = fVar80 * pfVar2[6] + pfVar1[6];
            auVar115._28_4_ = auVar121._28_4_ + pfVar1[7];
            auVar104 = vsubps_avx(auVar115,auVar275._0_32_);
            auVar13._4_4_ = auVar235._4_4_ * auVar104._4_4_;
            auVar13._0_4_ = auVar235._0_4_ * auVar104._0_4_;
            auVar13._8_4_ = auVar235._8_4_ * auVar104._8_4_;
            auVar13._12_4_ = auVar235._12_4_ * auVar104._12_4_;
            auVar13._16_4_ = auVar235._16_4_ * auVar104._16_4_;
            auVar13._20_4_ = auVar235._20_4_ * auVar104._20_4_;
            auVar13._24_4_ = auVar235._24_4_ * auVar104._24_4_;
            auVar13._28_4_ = auVar104._28_4_;
            pfVar2 = (float *)(uVar61 + 0x100 + uVar69);
            pfVar1 = (float *)(uVar61 + 0x40 + uVar69);
            auVar129._0_4_ = fVar80 * *pfVar2 + *pfVar1;
            auVar129._4_4_ = fVar80 * pfVar2[1] + pfVar1[1];
            auVar129._8_4_ = fVar80 * pfVar2[2] + pfVar1[2];
            auVar129._12_4_ = fVar80 * pfVar2[3] + pfVar1[3];
            auVar129._16_4_ = fVar80 * pfVar2[4] + pfVar1[4];
            auVar129._20_4_ = fVar80 * pfVar2[5] + pfVar1[5];
            auVar129._24_4_ = fVar80 * pfVar2[6] + pfVar1[6];
            auVar129._28_4_ = auVar136._28_4_ + pfVar1[7];
            auVar104 = vsubps_avx(auVar129,auVar183._0_32_);
            auVar14._4_4_ = auVar242._4_4_ * auVar104._4_4_;
            auVar14._0_4_ = auVar242._0_4_ * auVar104._0_4_;
            auVar14._8_4_ = auVar242._8_4_ * auVar104._8_4_;
            auVar14._12_4_ = auVar242._12_4_ * auVar104._12_4_;
            auVar14._16_4_ = auVar242._16_4_ * auVar104._16_4_;
            auVar14._20_4_ = auVar242._20_4_ * auVar104._20_4_;
            fVar91 = auVar104._28_4_;
            auVar14._24_4_ = auVar242._24_4_ * auVar104._24_4_;
            auVar14._28_4_ = fVar91;
            auVar104 = vmaxps_avx(auVar13,auVar14);
            auVar12 = vmaxps_avx(auVar264._0_32_,auVar12);
            pfVar2 = (float *)(uVar61 + 0x100 + uVar71);
            auVar104 = vmaxps_avx(auVar12,auVar104);
            pfVar1 = (float *)(uVar61 + 0x40 + uVar71);
            auVar116._0_4_ = fVar80 * *pfVar2 + *pfVar1;
            auVar116._4_4_ = fVar80 * pfVar2[1] + pfVar1[1];
            auVar116._8_4_ = fVar80 * pfVar2[2] + pfVar1[2];
            auVar116._12_4_ = fVar80 * pfVar2[3] + pfVar1[3];
            auVar116._16_4_ = fVar80 * pfVar2[4] + pfVar1[4];
            auVar116._20_4_ = fVar80 * pfVar2[5] + pfVar1[5];
            auVar116._24_4_ = fVar80 * pfVar2[6] + pfVar1[6];
            auVar116._28_4_ = fVar91 + pfVar1[7];
            auVar12 = vsubps_avx(auVar116,auVar303._0_32_);
            pfVar2 = (float *)(uVar61 + 0x100 + uVar72);
            pfVar1 = (float *)(uVar61 + 0x40 + uVar72);
            auVar130._0_4_ = fVar80 * *pfVar2 + *pfVar1;
            auVar130._4_4_ = fVar80 * pfVar2[1] + pfVar1[1];
            auVar130._8_4_ = fVar80 * pfVar2[2] + pfVar1[2];
            auVar130._12_4_ = fVar80 * pfVar2[3] + pfVar1[3];
            auVar130._16_4_ = fVar80 * pfVar2[4] + pfVar1[4];
            auVar130._20_4_ = fVar80 * pfVar2[5] + pfVar1[5];
            auVar130._24_4_ = fVar80 * pfVar2[6] + pfVar1[6];
            auVar130._28_4_ = fVar91 + pfVar1[7];
            auVar15._4_4_ = auVar256._4_4_ * auVar12._4_4_;
            auVar15._0_4_ = auVar256._0_4_ * auVar12._0_4_;
            auVar15._8_4_ = auVar256._8_4_ * auVar12._8_4_;
            auVar15._12_4_ = auVar256._12_4_ * auVar12._12_4_;
            auVar15._16_4_ = auVar256._16_4_ * auVar12._16_4_;
            auVar15._20_4_ = auVar256._20_4_ * auVar12._20_4_;
            auVar15._24_4_ = auVar256._24_4_ * auVar12._24_4_;
            auVar15._28_4_ = auVar12._28_4_;
            auVar12 = vsubps_avx(auVar130,auVar275._0_32_);
            pfVar2 = (float *)(uVar61 + 0x100 + uVar73);
            auVar16._4_4_ = auVar261._4_4_ * auVar12._4_4_;
            auVar16._0_4_ = auVar261._0_4_ * auVar12._0_4_;
            auVar16._8_4_ = auVar261._8_4_ * auVar12._8_4_;
            auVar16._12_4_ = auVar261._12_4_ * auVar12._12_4_;
            auVar16._16_4_ = auVar261._16_4_ * auVar12._16_4_;
            auVar16._20_4_ = auVar261._20_4_ * auVar12._20_4_;
            auVar16._24_4_ = auVar261._24_4_ * auVar12._24_4_;
            auVar16._28_4_ = auVar12._28_4_;
            pfVar1 = (float *)(uVar61 + 0x40 + uVar73);
            auVar145._0_4_ = fVar80 * *pfVar2 + *pfVar1;
            auVar145._4_4_ = fVar80 * pfVar2[1] + pfVar1[1];
            auVar145._8_4_ = fVar80 * pfVar2[2] + pfVar1[2];
            auVar145._12_4_ = fVar80 * pfVar2[3] + pfVar1[3];
            auVar145._16_4_ = fVar80 * pfVar2[4] + pfVar1[4];
            auVar145._20_4_ = fVar80 * pfVar2[5] + pfVar1[5];
            auVar145._24_4_ = fVar80 * pfVar2[6] + pfVar1[6];
            auVar145._28_4_ = auVar153._28_4_ + pfVar1[7];
            auVar12 = vsubps_avx(auVar145,auVar183._0_32_);
            auVar17._4_4_ = auVar288._4_4_ * auVar12._4_4_;
            auVar17._0_4_ = auVar288._0_4_ * auVar12._0_4_;
            auVar17._8_4_ = auVar288._8_4_ * auVar12._8_4_;
            auVar17._12_4_ = auVar288._12_4_ * auVar12._12_4_;
            auVar17._16_4_ = auVar288._16_4_ * auVar12._16_4_;
            auVar17._20_4_ = auVar288._20_4_ * auVar12._20_4_;
            auVar17._24_4_ = auVar288._24_4_ * auVar12._24_4_;
            auVar17._28_4_ = auVar12._28_4_;
            auVar153 = ZEXT3264(auVar17);
            auVar12 = vminps_avx(auVar16,auVar17);
            auVar136 = ZEXT3264(auVar12);
            auVar13 = vminps_avx(auVar171._0_32_,auVar15);
            auVar12 = vminps_avx(auVar13,auVar12);
            auVar104 = vcmpps_avx(auVar104,auVar12,2);
            auVar108 = ZEXT3264(auVar104);
            if (((uint)uVar76 & 7) == 6) {
              auVar12 = vcmpps_avx(*(undefined1 (*) [32])(uVar61 + 0x1c0),auVar86,2);
              auVar13 = vcmpps_avx(auVar86,*(undefined1 (*) [32])(uVar61 + 0x1e0),1);
              auVar13 = vandps_avx(auVar12,auVar13);
              auVar104 = vandps_avx(auVar13,auVar104);
              auVar108 = ZEXT1664(auVar104._16_16_);
              auVar81 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
            }
            else {
              auVar81 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
            }
            auVar121 = ZEXT3264(auVar12);
            auVar81 = vpsllw_avx(auVar81,0xf);
            auVar81 = vpacksswb_avx(auVar81,auVar81);
            unaff_R12 = (ulong)(byte)(SUB161(auVar81 >> 7,0) & 1 |
                                      (SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar81 >> 0x3f,0) << 7);
          }
          if ((uVar76 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar60 = 4;
            }
            else {
              uVar61 = uVar76 & 0xfffffffffffffff0;
              lVar64 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                }
              }
              iVar60 = 0;
              uVar76 = *(ulong *)(uVar61 + lVar64 * 8);
              uVar67 = unaff_R12 - 1 & unaff_R12;
              if (uVar67 != 0) {
                *puVar77 = uVar76;
                lVar64 = 0;
                if (uVar67 != 0) {
                  for (; (uVar67 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                  }
                }
                uVar63 = uVar67 - 1;
                while( true ) {
                  puVar77 = puVar77 + 1;
                  uVar76 = *(ulong *)(uVar61 + lVar64 * 8);
                  uVar63 = uVar63 & uVar67;
                  if (uVar63 == 0) break;
                  *puVar77 = uVar76;
                  lVar64 = 0;
                  if (uVar63 != 0) {
                    for (; (uVar63 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  uVar67 = uVar63 - 1;
                }
              }
            }
          }
          else {
            iVar60 = 6;
          }
        } while (iVar60 == 0);
        if (iVar60 == 6) {
          uVar61 = (ulong)((uint)uVar76 & 0xf) - 8;
          bVar78 = uVar61 != 0;
          if (bVar78) {
            uVar76 = uVar76 & 0xfffffffffffffff0;
            local_1700 = 0;
            do {
              lVar64 = local_1700 * 0xe0;
              uVar67 = *(ulong *)(uVar76 + 0x40 + lVar64);
              auVar82._8_8_ = 0;
              auVar82._0_8_ = uVar67;
              auVar81 = vpmovzxbd_avx(auVar82);
              uVar63 = *(ulong *)(uVar76 + 0x44 + lVar64);
              auVar124._8_8_ = 0;
              auVar124._0_8_ = uVar63;
              auVar128 = vpmovzxbd_avx(auVar124);
              auVar146._16_16_ = auVar128;
              auVar146._0_16_ = auVar81;
              auVar102._8_8_ = 0;
              auVar102._0_8_ = *(ulong *)(uVar76 + 0x48 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar102);
              auVar174._8_8_ = 0;
              auVar174._0_8_ = *(ulong *)(uVar76 + 0x4c + lVar64);
              auVar128 = vpmovzxbd_avx(auVar174);
              auVar161._16_16_ = auVar128;
              auVar161._0_16_ = auVar81;
              auVar81 = vpminub_avx(auVar82,auVar102);
              auVar83._8_8_ = 0;
              auVar83._0_8_ = uVar67;
              _local_17a0 = vpcmpeqb_avx(auVar83,auVar81);
              auVar81 = vpminub_avx(auVar124,auVar174);
              auVar125._8_8_ = 0;
              auVar125._0_8_ = uVar63;
              local_1750 = vpcmpeqb_avx(auVar125,auVar81);
              auVar104 = vcvtdq2ps_avx(auVar146);
              fVar80 = *(float *)(uVar76 + 0x7c + lVar64);
              fVar91 = *(float *)(uVar76 + 0x70 + lVar64);
              auVar131._0_4_ = fVar91 + fVar80 * auVar104._0_4_;
              auVar131._4_4_ = fVar91 + fVar80 * auVar104._4_4_;
              auVar131._8_4_ = fVar91 + fVar80 * auVar104._8_4_;
              auVar131._12_4_ = fVar91 + fVar80 * auVar104._12_4_;
              auVar131._16_4_ = fVar91 + fVar80 * auVar104._16_4_;
              auVar131._20_4_ = fVar91 + fVar80 * auVar104._20_4_;
              auVar131._24_4_ = fVar91 + fVar80 * auVar104._24_4_;
              auVar131._28_4_ = fVar91 + auVar104._28_4_;
              auVar198._8_8_ = 0;
              auVar198._0_8_ = *(ulong *)(uVar76 + 0x88 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar198);
              auVar225._8_8_ = 0;
              auVar225._0_8_ = *(ulong *)(uVar76 + 0x8c + lVar64);
              auVar128 = vpmovzxbd_avx(auVar225);
              auVar203._16_16_ = auVar128;
              auVar203._0_16_ = auVar81;
              auVar104 = vcvtdq2ps_avx(auVar203);
              fVar93 = *(float *)(uVar76 + 0xc4 + lVar64);
              fVar95 = *(float *)(uVar76 + 0xb8 + lVar64);
              auVar204._0_4_ = fVar95 + fVar93 * auVar104._0_4_;
              auVar204._4_4_ = fVar95 + fVar93 * auVar104._4_4_;
              auVar204._8_4_ = fVar95 + fVar93 * auVar104._8_4_;
              auVar204._12_4_ = fVar95 + fVar93 * auVar104._12_4_;
              auVar204._16_4_ = fVar95 + fVar93 * auVar104._16_4_;
              auVar204._20_4_ = fVar95 + fVar93 * auVar104._20_4_;
              auVar204._24_4_ = fVar95 + fVar93 * auVar104._24_4_;
              auVar204._28_4_ = fVar95 + auVar104._28_4_;
              auVar81 = ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                       *(float *)(uVar76 + 0xd0 + lVar64)) *
                                      *(float *)(uVar76 + 0xd4 + lVar64)));
              auVar81 = vshufps_avx(auVar81,auVar81,0);
              auVar104 = vsubps_avx(auVar204,auVar131);
              fVar97 = auVar81._0_4_;
              fVar99 = auVar81._4_4_;
              fVar101 = auVar81._8_4_;
              fVar137 = auVar81._12_4_;
              auVar132._0_4_ = auVar131._0_4_ + fVar97 * auVar104._0_4_;
              auVar132._4_4_ = auVar131._4_4_ + fVar99 * auVar104._4_4_;
              auVar132._8_4_ = auVar131._8_4_ + fVar101 * auVar104._8_4_;
              auVar132._12_4_ = auVar131._12_4_ + fVar137 * auVar104._12_4_;
              auVar132._16_4_ = auVar131._16_4_ + fVar97 * auVar104._16_4_;
              auVar132._20_4_ = auVar131._20_4_ + fVar99 * auVar104._20_4_;
              auVar132._24_4_ = auVar131._24_4_ + fVar101 * auVar104._24_4_;
              auVar132._28_4_ = auVar131._28_4_ + auVar104._28_4_;
              auVar104 = vcvtdq2ps_avx(auVar161);
              auVar147._0_4_ = fVar91 + fVar80 * auVar104._0_4_;
              auVar147._4_4_ = fVar91 + fVar80 * auVar104._4_4_;
              auVar147._8_4_ = fVar91 + fVar80 * auVar104._8_4_;
              auVar147._12_4_ = fVar91 + fVar80 * auVar104._12_4_;
              auVar147._16_4_ = fVar91 + fVar80 * auVar104._16_4_;
              auVar147._20_4_ = fVar91 + fVar80 * auVar104._20_4_;
              auVar147._24_4_ = fVar91 + fVar80 * auVar104._24_4_;
              auVar147._28_4_ = fVar91 + fVar80;
              auVar156._8_8_ = 0;
              auVar156._0_8_ = *(ulong *)(uVar76 + 0x90 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar156);
              auVar175._8_8_ = 0;
              auVar175._0_8_ = *(ulong *)(uVar76 + 0x94 + lVar64);
              auVar128 = vpmovzxbd_avx(auVar175);
              auVar162._16_16_ = auVar128;
              auVar162._0_16_ = auVar81;
              auVar104 = vcvtdq2ps_avx(auVar162);
              auVar163._0_4_ = fVar95 + fVar93 * auVar104._0_4_;
              auVar163._4_4_ = fVar95 + fVar93 * auVar104._4_4_;
              auVar163._8_4_ = fVar95 + fVar93 * auVar104._8_4_;
              auVar163._12_4_ = fVar95 + fVar93 * auVar104._12_4_;
              auVar163._16_4_ = fVar95 + fVar93 * auVar104._16_4_;
              auVar163._20_4_ = fVar95 + fVar93 * auVar104._20_4_;
              auVar163._24_4_ = fVar95 + fVar93 * auVar104._24_4_;
              auVar163._28_4_ = fVar95 + auVar104._28_4_;
              auVar104 = vsubps_avx(auVar163,auVar147);
              auVar148._0_4_ = auVar147._0_4_ + fVar97 * auVar104._0_4_;
              auVar148._4_4_ = auVar147._4_4_ + fVar99 * auVar104._4_4_;
              auVar148._8_4_ = auVar147._8_4_ + fVar101 * auVar104._8_4_;
              auVar148._12_4_ = auVar147._12_4_ + fVar137 * auVar104._12_4_;
              auVar148._16_4_ = auVar147._16_4_ + fVar97 * auVar104._16_4_;
              auVar148._20_4_ = auVar147._20_4_ + fVar99 * auVar104._20_4_;
              auVar148._24_4_ = auVar147._24_4_ + fVar101 * auVar104._24_4_;
              auVar148._28_4_ = auVar147._28_4_ + auVar104._28_4_;
              auVar157._8_8_ = 0;
              auVar157._0_8_ = *(ulong *)(uVar76 + 0x50 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar157);
              auVar176._8_8_ = 0;
              auVar176._0_8_ = *(ulong *)(uVar76 + 0x54 + lVar64);
              auVar128 = vpmovzxbd_avx(auVar176);
              auVar164._16_16_ = auVar128;
              auVar164._0_16_ = auVar81;
              fVar80 = *(float *)(uVar76 + 0x80 + lVar64);
              auVar104 = vcvtdq2ps_avx(auVar164);
              fVar91 = *(float *)(uVar76 + 0x74 + lVar64);
              auVar165._0_4_ = fVar91 + fVar80 * auVar104._0_4_;
              auVar165._4_4_ = fVar91 + fVar80 * auVar104._4_4_;
              auVar165._8_4_ = fVar91 + fVar80 * auVar104._8_4_;
              auVar165._12_4_ = fVar91 + fVar80 * auVar104._12_4_;
              auVar165._16_4_ = fVar91 + fVar80 * auVar104._16_4_;
              auVar165._20_4_ = fVar91 + fVar80 * auVar104._20_4_;
              auVar165._24_4_ = fVar91 + fVar80 * auVar104._24_4_;
              auVar165._28_4_ = fVar91 + auVar104._28_4_;
              auVar226._8_8_ = 0;
              auVar226._0_8_ = *(ulong *)(uVar76 + 0x98 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar226);
              auVar237._8_8_ = 0;
              auVar237._0_8_ = *(ulong *)(uVar76 + 0x9c + lVar64);
              auVar128 = vpmovzxbd_avx(auVar237);
              auVar230._16_16_ = auVar128;
              auVar230._0_16_ = auVar81;
              fVar93 = *(float *)(uVar76 + 200 + lVar64);
              auVar104 = vcvtdq2ps_avx(auVar230);
              fVar95 = *(float *)(uVar76 + 0xbc + lVar64);
              auVar231._0_4_ = fVar95 + fVar93 * auVar104._0_4_;
              auVar231._4_4_ = fVar95 + fVar93 * auVar104._4_4_;
              auVar231._8_4_ = fVar95 + fVar93 * auVar104._8_4_;
              auVar231._12_4_ = fVar95 + fVar93 * auVar104._12_4_;
              auVar231._16_4_ = fVar95 + fVar93 * auVar104._16_4_;
              auVar231._20_4_ = fVar95 + fVar93 * auVar104._20_4_;
              auVar231._24_4_ = fVar95 + fVar93 * auVar104._24_4_;
              auVar231._28_4_ = fVar95 + auVar104._28_4_;
              auVar104 = vsubps_avx(auVar231,auVar165);
              auVar166._0_4_ = auVar104._0_4_ * fVar97 + auVar165._0_4_;
              auVar166._4_4_ = auVar104._4_4_ * fVar99 + auVar165._4_4_;
              auVar166._8_4_ = auVar104._8_4_ * fVar101 + auVar165._8_4_;
              auVar166._12_4_ = auVar104._12_4_ * fVar137 + auVar165._12_4_;
              auVar166._16_4_ = auVar104._16_4_ * fVar97 + auVar165._16_4_;
              auVar166._20_4_ = auVar104._20_4_ * fVar99 + auVar165._20_4_;
              auVar166._24_4_ = auVar104._24_4_ * fVar101 + auVar165._24_4_;
              auVar166._28_4_ = auVar104._28_4_ + auVar165._28_4_;
              auVar227._8_8_ = 0;
              auVar227._0_8_ = *(ulong *)(uVar76 + 0x58 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar227);
              auVar257._8_8_ = 0;
              auVar257._0_8_ = *(ulong *)(uVar76 + 0x5c + lVar64);
              auVar128 = vpmovzxbd_avx(auVar257);
              auVar232._16_16_ = auVar128;
              auVar232._0_16_ = auVar81;
              auVar104 = vcvtdq2ps_avx(auVar232);
              auVar179._0_4_ = fVar91 + auVar104._0_4_ * fVar80;
              auVar179._4_4_ = fVar91 + auVar104._4_4_ * fVar80;
              auVar179._8_4_ = fVar91 + auVar104._8_4_ * fVar80;
              auVar179._12_4_ = fVar91 + auVar104._12_4_ * fVar80;
              auVar179._16_4_ = fVar91 + auVar104._16_4_ * fVar80;
              auVar179._20_4_ = fVar91 + auVar104._20_4_ * fVar80;
              auVar179._24_4_ = fVar91 + auVar104._24_4_ * fVar80;
              auVar179._28_4_ = fVar91 + fVar80;
              auVar199._8_8_ = 0;
              auVar199._0_8_ = *(ulong *)(uVar76 + 0xa0 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar199);
              auVar228._8_8_ = 0;
              auVar228._0_8_ = *(ulong *)(uVar76 + 0xa4 + lVar64);
              auVar128 = vpmovzxbd_avx(auVar228);
              auVar205._16_16_ = auVar128;
              auVar205._0_16_ = auVar81;
              auVar104 = vcvtdq2ps_avx(auVar205);
              auVar206._0_4_ = fVar95 + fVar93 * auVar104._0_4_;
              auVar206._4_4_ = fVar95 + fVar93 * auVar104._4_4_;
              auVar206._8_4_ = fVar95 + fVar93 * auVar104._8_4_;
              auVar206._12_4_ = fVar95 + fVar93 * auVar104._12_4_;
              auVar206._16_4_ = fVar95 + fVar93 * auVar104._16_4_;
              auVar206._20_4_ = fVar95 + fVar93 * auVar104._20_4_;
              auVar206._24_4_ = fVar95 + fVar93 * auVar104._24_4_;
              auVar206._28_4_ = fVar95 + auVar104._28_4_;
              auVar104 = vsubps_avx(auVar206,auVar179);
              auVar180._0_4_ = auVar179._0_4_ + fVar97 * auVar104._0_4_;
              auVar180._4_4_ = auVar179._4_4_ + fVar99 * auVar104._4_4_;
              auVar180._8_4_ = auVar179._8_4_ + fVar101 * auVar104._8_4_;
              auVar180._12_4_ = auVar179._12_4_ + fVar137 * auVar104._12_4_;
              auVar180._16_4_ = auVar179._16_4_ + fVar97 * auVar104._16_4_;
              auVar180._20_4_ = auVar179._20_4_ + fVar99 * auVar104._20_4_;
              auVar180._24_4_ = auVar179._24_4_ + fVar101 * auVar104._24_4_;
              auVar180._28_4_ = auVar179._28_4_ + auVar104._28_4_;
              auVar200._8_8_ = 0;
              auVar200._0_8_ = *(ulong *)(uVar76 + 0x60 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar200);
              auVar229._8_8_ = 0;
              auVar229._0_8_ = *(ulong *)(uVar76 + 100 + lVar64);
              auVar128 = vpmovzxbd_avx(auVar229);
              auVar207._16_16_ = auVar128;
              auVar207._0_16_ = auVar81;
              fVar80 = *(float *)(uVar76 + 0x84 + lVar64);
              fVar91 = *(float *)(uVar76 + 0x78 + lVar64);
              auVar104 = vcvtdq2ps_avx(auVar207);
              auVar208._0_4_ = fVar91 + fVar80 * auVar104._0_4_;
              auVar208._4_4_ = fVar91 + fVar80 * auVar104._4_4_;
              auVar208._8_4_ = fVar91 + fVar80 * auVar104._8_4_;
              auVar208._12_4_ = fVar91 + fVar80 * auVar104._12_4_;
              auVar208._16_4_ = fVar91 + fVar80 * auVar104._16_4_;
              auVar208._20_4_ = fVar91 + fVar80 * auVar104._20_4_;
              auVar208._24_4_ = fVar91 + fVar80 * auVar104._24_4_;
              auVar208._28_4_ = fVar91 + auVar104._28_4_;
              auVar249._8_8_ = 0;
              auVar249._0_8_ = *(ulong *)(uVar76 + 0xa8 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar249);
              auVar258._8_8_ = 0;
              auVar258._0_8_ = *(ulong *)(uVar76 + 0xac + lVar64);
              auVar128 = vpmovzxbd_avx(auVar258);
              auVar252._16_16_ = auVar128;
              auVar252._0_16_ = auVar81;
              fVar93 = *(float *)(uVar76 + 0xcc + lVar64);
              fVar95 = *(float *)(uVar76 + 0xc0 + lVar64);
              auVar104 = vcvtdq2ps_avx(auVar252);
              auVar253._0_4_ = fVar95 + fVar93 * auVar104._0_4_;
              auVar253._4_4_ = fVar95 + fVar93 * auVar104._4_4_;
              auVar253._8_4_ = fVar95 + fVar93 * auVar104._8_4_;
              auVar253._12_4_ = fVar95 + fVar93 * auVar104._12_4_;
              auVar253._16_4_ = fVar95 + fVar93 * auVar104._16_4_;
              auVar253._20_4_ = fVar95 + fVar93 * auVar104._20_4_;
              auVar253._24_4_ = fVar95 + fVar93 * auVar104._24_4_;
              auVar253._28_4_ = fVar95 + auVar104._28_4_;
              auVar104 = vsubps_avx(auVar253,auVar208);
              auVar209._0_4_ = auVar104._0_4_ * fVar97 + auVar208._0_4_;
              auVar209._4_4_ = auVar104._4_4_ * fVar99 + auVar208._4_4_;
              auVar209._8_4_ = auVar104._8_4_ * fVar101 + auVar208._8_4_;
              auVar209._12_4_ = auVar104._12_4_ * fVar137 + auVar208._12_4_;
              auVar209._16_4_ = auVar104._16_4_ * fVar97 + auVar208._16_4_;
              auVar209._20_4_ = auVar104._20_4_ * fVar99 + auVar208._20_4_;
              auVar209._24_4_ = auVar104._24_4_ * fVar101 + auVar208._24_4_;
              auVar209._28_4_ = auVar104._28_4_ + auVar208._28_4_;
              auVar250._8_8_ = 0;
              auVar250._0_8_ = *(ulong *)(uVar76 + 0x68 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar250);
              auVar273._8_8_ = 0;
              auVar273._0_8_ = *(ulong *)(uVar76 + 0x6c + lVar64);
              auVar128 = vpmovzxbd_avx(auVar273);
              auVar254._16_16_ = auVar128;
              auVar254._0_16_ = auVar81;
              auVar275 = ZEXT3264(local_1680);
              auVar104 = vcvtdq2ps_avx(auVar254);
              auVar233._0_4_ = fVar91 + fVar80 * auVar104._0_4_;
              auVar233._4_4_ = fVar91 + fVar80 * auVar104._4_4_;
              auVar233._8_4_ = fVar91 + fVar80 * auVar104._8_4_;
              auVar233._12_4_ = fVar91 + fVar80 * auVar104._12_4_;
              auVar233._16_4_ = fVar91 + fVar80 * auVar104._16_4_;
              auVar233._20_4_ = fVar91 + fVar80 * auVar104._20_4_;
              auVar233._24_4_ = fVar91 + fVar80 * auVar104._24_4_;
              auVar233._28_4_ = fVar91 + fVar80;
              auVar238._8_8_ = 0;
              auVar238._0_8_ = *(ulong *)(uVar76 + 0xb0 + lVar64);
              auVar81 = vpmovzxbd_avx(auVar238);
              auVar251._8_8_ = 0;
              auVar251._0_8_ = *(ulong *)(uVar76 + 0xb4 + lVar64);
              auVar128 = vpmovzxbd_avx(auVar251);
              auVar239._16_16_ = auVar128;
              auVar239._0_16_ = auVar81;
              auVar104 = vcvtdq2ps_avx(auVar239);
              auVar240._0_4_ = fVar95 + fVar93 * auVar104._0_4_;
              auVar240._4_4_ = fVar95 + fVar93 * auVar104._4_4_;
              auVar240._8_4_ = fVar95 + fVar93 * auVar104._8_4_;
              auVar240._12_4_ = fVar95 + fVar93 * auVar104._12_4_;
              auVar240._16_4_ = fVar95 + fVar93 * auVar104._16_4_;
              auVar240._20_4_ = fVar95 + fVar93 * auVar104._20_4_;
              auVar240._24_4_ = fVar95 + fVar93 * auVar104._24_4_;
              auVar240._28_4_ = fVar95 + auVar104._28_4_;
              auVar104 = vsubps_avx(auVar240,auVar233);
              auVar234._0_4_ = auVar233._0_4_ + auVar104._0_4_ * fVar97;
              auVar234._4_4_ = auVar233._4_4_ + auVar104._4_4_ * fVar99;
              auVar234._8_4_ = auVar233._8_4_ + auVar104._8_4_ * fVar101;
              auVar234._12_4_ = auVar233._12_4_ + auVar104._12_4_ * fVar137;
              auVar234._16_4_ = auVar233._16_4_ + auVar104._16_4_ * fVar97;
              auVar234._20_4_ = auVar233._20_4_ + auVar104._20_4_ * fVar99;
              auVar234._24_4_ = auVar233._24_4_ + auVar104._24_4_ * fVar101;
              auVar234._28_4_ = auVar233._28_4_ + fVar137;
              auVar104 = vsubps_avx(auVar132,auVar303._0_32_);
              auVar113._0_4_ = auVar104._0_4_ * (float)local_1540._0_4_;
              auVar113._4_4_ = auVar104._4_4_ * (float)local_1540._4_4_;
              auVar113._8_4_ = auVar104._8_4_ * fStack_1538;
              auVar113._12_4_ = auVar104._12_4_ * fStack_1534;
              auVar18._16_4_ = auVar104._16_4_ * fStack_1530;
              auVar18._0_16_ = auVar113;
              auVar18._20_4_ = auVar104._20_4_ * fStack_152c;
              auVar18._24_4_ = auVar104._24_4_ * fStack_1528;
              auVar18._28_4_ = auVar104._28_4_;
              auVar104 = vsubps_avx(auVar166,local_1680);
              auVar126._0_4_ = auVar104._0_4_ * (float)local_1560._0_4_;
              auVar126._4_4_ = auVar104._4_4_ * (float)local_1560._4_4_;
              auVar126._8_4_ = auVar104._8_4_ * fStack_1558;
              auVar126._12_4_ = auVar104._12_4_ * fStack_1554;
              auVar19._16_4_ = auVar104._16_4_ * fStack_1550;
              auVar19._0_16_ = auVar126;
              auVar19._20_4_ = auVar104._20_4_ * fStack_154c;
              auVar19._24_4_ = auVar104._24_4_ * fStack_1548;
              auVar19._28_4_ = auVar104._28_4_;
              auVar104 = vsubps_avx(auVar209,auVar183._0_32_);
              auVar158._0_4_ = auVar104._0_4_ * (float)local_1580._0_4_;
              auVar158._4_4_ = auVar104._4_4_ * (float)local_1580._4_4_;
              auVar158._8_4_ = auVar104._8_4_ * fStack_1578;
              auVar158._12_4_ = auVar104._12_4_ * fStack_1574;
              auVar20._16_4_ = auVar104._16_4_ * fStack_1570;
              auVar20._0_16_ = auVar158;
              auVar20._20_4_ = auVar104._20_4_ * fStack_156c;
              auVar20._24_4_ = auVar104._24_4_ * fStack_1568;
              auVar20._28_4_ = auVar104._28_4_;
              auVar104 = vsubps_avx(auVar148,auVar303._0_32_);
              auVar142._0_4_ = auVar256._0_4_ * auVar104._0_4_;
              auVar142._4_4_ = auVar256._4_4_ * auVar104._4_4_;
              auVar142._8_4_ = auVar256._8_4_ * auVar104._8_4_;
              auVar142._12_4_ = auVar256._12_4_ * auVar104._12_4_;
              auVar21._16_4_ = auVar256._16_4_ * auVar104._16_4_;
              auVar21._0_16_ = auVar142;
              auVar21._20_4_ = auVar256._20_4_ * auVar104._20_4_;
              auVar21._24_4_ = auVar256._24_4_ * auVar104._24_4_;
              auVar21._28_4_ = auVar104._28_4_;
              auVar153 = ZEXT3264(auVar21);
              auVar104 = vsubps_avx(auVar180,local_1680);
              auVar177._0_4_ = auVar261._0_4_ * auVar104._0_4_;
              auVar177._4_4_ = auVar261._4_4_ * auVar104._4_4_;
              auVar177._8_4_ = auVar261._8_4_ * auVar104._8_4_;
              auVar177._12_4_ = auVar261._12_4_ * auVar104._12_4_;
              auVar22._16_4_ = auVar261._16_4_ * auVar104._16_4_;
              auVar22._0_16_ = auVar177;
              auVar22._20_4_ = auVar261._20_4_ * auVar104._20_4_;
              auVar22._24_4_ = auVar261._24_4_ * auVar104._24_4_;
              auVar22._28_4_ = auVar104._28_4_;
              auVar104 = vsubps_avx(auVar234,auVar183._0_32_);
              auVar288 = ZEXT3264(local_16a0);
              auVar201._0_4_ = local_16a0._0_4_ * auVar104._0_4_;
              auVar201._4_4_ = local_16a0._4_4_ * auVar104._4_4_;
              auVar201._8_4_ = local_16a0._8_4_ * auVar104._8_4_;
              auVar201._12_4_ = local_16a0._12_4_ * auVar104._12_4_;
              auVar23._16_4_ = local_16a0._16_4_ * auVar104._16_4_;
              auVar23._0_16_ = auVar201;
              auVar23._20_4_ = local_16a0._20_4_ * auVar104._20_4_;
              auVar23._24_4_ = local_16a0._24_4_ * auVar104._24_4_;
              auVar23._28_4_ = auVar104._28_4_;
              auVar128 = vpminsd_avx(auVar18._16_16_,auVar21._16_16_);
              auVar81 = vpmaxsd_avx(auVar18._16_16_,auVar21._16_16_);
              auVar82 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
              auVar128 = vpmaxsd_avx(auVar128,auVar82);
              auVar82 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
              auVar141 = vpminsd_avx(auVar81,auVar82);
              auVar82 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
              auVar81 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
              auVar82 = vpmaxsd_avx(auVar82,local_1420._0_16_);
              auVar264 = ZEXT3264(local_16c0);
              auVar128 = vpmaxsd_avx(auVar128,auVar82);
              auVar81 = vpminsd_avx(auVar81,local_1440._0_16_);
              auVar82 = vpminsd_avx(auVar141,auVar81);
              auVar81 = vpcmpeqd_avx(auVar261._0_16_,auVar261._0_16_);
              auVar141 = vpmovsxbd_avx(auVar81 ^ local_1750);
              auVar128 = vpcmpgtd_avx(auVar128,auVar82);
              auVar112 = vpor_avx(auVar128,auVar141);
              auVar128 = vpminsd_avx(auVar113,auVar142);
              auVar82 = vpminsd_avx(auVar126,auVar177);
              auVar128 = vpmaxsd_avx(auVar128,auVar82);
              auVar82 = vpminsd_avx(auVar158,auVar201);
              auVar82 = vpmaxsd_avx(auVar82,local_16c0._0_16_);
              auVar128 = vpmaxsd_avx(auVar128,auVar82);
              auVar82 = vpmaxsd_avx(auVar113,auVar142);
              auVar141 = vpmaxsd_avx(auVar126,auVar177);
              auVar141 = vpminsd_avx(auVar82,auVar141);
              auVar82 = vpmaxsd_avx(auVar158,auVar201);
              auVar171 = ZEXT3264(local_15c0);
              auVar82 = vpminsd_avx(auVar82,local_15c0._0_16_);
              auVar136 = ZEXT1664(auVar82);
              auVar82 = vpminsd_avx(auVar141,auVar82);
              auVar128 = vpcmpgtd_avx(auVar128,auVar82);
              auVar121 = ZEXT1664(auVar128);
              auVar81 = vpmovsxbd_avx(auVar81 ^ _local_17a0);
              auVar81 = vpor_avx(auVar128,auVar81);
              auVar87._16_16_ = auVar112;
              auVar87._0_16_ = auVar81;
              auVar104 = vcvtdq2ps_avx(auVar87);
              auVar105._8_4_ = 0xbf800000;
              auVar105._0_8_ = 0xbf800000bf800000;
              auVar105._12_4_ = 0xbf800000;
              auVar105._16_4_ = 0xbf800000;
              auVar105._20_4_ = 0xbf800000;
              auVar105._24_4_ = 0xbf800000;
              auVar105._28_4_ = 0xbf800000;
              auVar108 = ZEXT3264(auVar105);
              auVar104 = vcmpps_avx(auVar105,auVar104,1);
              uVar59 = vmovmskps_avx(auVar104);
              if (uVar59 != 0) {
                local_1708 = (ulong)(uVar59 & 0xff);
                local_17c8 = puVar77;
                local_1718 = lVar64 + uVar76;
                pRVar65 = ray;
                local_1818 = uVar61;
                do {
                  ray = local_1710;
                  puVar77 = local_17c8;
                  uVar74 = local_17d0;
                  lVar64 = 0;
                  if (local_1708 != 0) {
                    for (; (local_1708 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  uVar5 = *(ushort *)(local_1718 + lVar64 * 8);
                  uVar6 = *(ushort *)(local_1718 + 2 + lVar64 * 8);
                  uVar67 = CONCAT44(0,*(uint *)(local_1718 + 0xd8));
                  local_1720 = (ulong)*(uint *)(local_1718 + 4 + lVar64 * 8);
                  local_16e8 = local_17e8->scene;
                  local_1750._0_8_ = uVar67;
                  pGVar7 = (local_16e8->geometries).items[uVar67].ptr;
                  local_16f0 = *(long *)&pGVar7->field_0x58;
                  local_16f8 = pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_1720;
                  fVar80 = (pGVar7->time_range).lower;
                  fVar80 = pGVar7->fnumTimeSegments *
                           (((pRVar65->dir).field_0.m128[3] - fVar80) /
                           ((pGVar7->time_range).upper - fVar80));
                  auVar81 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),9);
                  auVar81 = vminss_avx(auVar81,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
                  auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
                  local_17d8 = uVar5 & 0x7fff;
                  local_17dc = uVar6 & 0x7fff;
                  uVar59 = *(uint *)(local_16f0 + 4 + local_16f8);
                  uVar71 = (ulong)uVar59;
                  uVar69 = (ulong)(uVar59 * local_17dc +
                                  *(int *)(local_16f0 + local_16f8) + local_17d8);
                  lVar8 = *(long *)&pGVar7[2].numPrimitives;
                  lVar70 = (long)(int)auVar84._0_4_ * 0x38;
                  lVar9 = *(long *)(lVar8 + 0x10 + lVar70);
                  lVar10 = *(long *)(lVar8 + lVar70);
                  auVar81 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar69);
                  lVar11 = *(long *)(lVar8 + 0x48 + lVar70);
                  auVar128 = *(undefined1 (*) [16])(lVar10 + (uVar69 + 1) * lVar9);
                  lVar64 = uVar69 + uVar71;
                  auVar82 = *(undefined1 (*) [16])(lVar10 + lVar64 * lVar9);
                  lVar75 = uVar69 + uVar71 + 1;
                  auVar141 = *(undefined1 (*) [16])(lVar10 + lVar75 * lVar9);
                  uVar68 = (ulong)(-1 < (short)uVar5);
                  lVar62 = uVar69 + uVar68 + 1;
                  auVar112 = *(undefined1 (*) [16])(lVar10 + lVar62 * lVar9);
                  lVar66 = uVar68 + lVar75;
                  auVar123 = *(undefined1 (*) [16])(lVar10 + lVar66 * lVar9);
                  uVar68 = 0;
                  if (-1 < (short)uVar6) {
                    uVar68 = uVar71;
                  }
                  auVar83 = *(undefined1 (*) [16])(lVar10 + (lVar64 + uVar68) * lVar9);
                  auVar102 = *(undefined1 (*) [16])(lVar10 + (lVar75 + uVar68) * lVar9);
                  auVar113 = *(undefined1 (*) [16])(lVar10 + lVar9 * (uVar68 + lVar66));
                  lVar8 = *(long *)(lVar8 + 0x38 + lVar70);
                  auVar84 = ZEXT416((uint)(fVar80 - auVar84._0_4_));
                  auVar84 = vshufps_avx(auVar84,auVar84,0);
                  auVar124 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * uVar69),auVar81);
                  fVar80 = auVar84._0_4_;
                  fVar91 = auVar84._4_4_;
                  fVar93 = auVar84._8_4_;
                  fVar95 = auVar84._12_4_;
                  auVar259._0_4_ = auVar124._0_4_ * fVar80 + auVar81._0_4_;
                  auVar259._4_4_ = auVar124._4_4_ * fVar91 + auVar81._4_4_;
                  auVar259._8_4_ = auVar124._8_4_ * fVar93 + auVar81._8_4_;
                  auVar259._12_4_ = auVar124._12_4_ * fVar95 + auVar81._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (uVar69 + 1)),
                                       auVar128);
                  auVar114._0_4_ = auVar81._0_4_ * fVar80 + auVar128._0_4_;
                  auVar114._4_4_ = auVar81._4_4_ * fVar91 + auVar128._4_4_;
                  auVar114._8_4_ = auVar81._8_4_ * fVar93 + auVar128._8_4_;
                  auVar114._12_4_ = auVar81._12_4_ * fVar95 + auVar128._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar64),auVar82);
                  auVar143._0_4_ = auVar81._0_4_ * fVar80 + auVar82._0_4_;
                  auVar143._4_4_ = auVar81._4_4_ * fVar91 + auVar82._4_4_;
                  auVar143._8_4_ = auVar81._8_4_ * fVar93 + auVar82._8_4_;
                  auVar143._12_4_ = auVar81._12_4_ * fVar95 + auVar82._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar75),auVar141);
                  auVar103._0_4_ = auVar81._0_4_ * fVar80 + auVar141._0_4_;
                  auVar103._4_4_ = auVar81._4_4_ * fVar91 + auVar141._4_4_;
                  auVar103._8_4_ = auVar81._8_4_ * fVar93 + auVar141._8_4_;
                  auVar103._12_4_ = auVar81._12_4_ * fVar95 + auVar141._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar62),auVar112);
                  auVar178._0_4_ = auVar81._0_4_ * fVar80 + auVar112._0_4_;
                  auVar178._4_4_ = auVar81._4_4_ * fVar91 + auVar112._4_4_;
                  auVar178._8_4_ = auVar81._8_4_ * fVar93 + auVar112._8_4_;
                  auVar178._12_4_ = auVar81._12_4_ * fVar95 + auVar112._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar66),auVar123);
                  auVar159._0_4_ = auVar123._0_4_ + fVar80 * auVar81._0_4_;
                  auVar159._4_4_ = auVar123._4_4_ + fVar91 * auVar81._4_4_;
                  auVar159._8_4_ = auVar123._8_4_ + fVar93 * auVar81._8_4_;
                  auVar159._12_4_ = auVar123._12_4_ + fVar95 * auVar81._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar64 + uVar68)),
                                       auVar83);
                  auVar127._0_4_ = auVar83._0_4_ + fVar80 * auVar81._0_4_;
                  auVar127._4_4_ = auVar83._4_4_ + fVar91 * auVar81._4_4_;
                  auVar127._8_4_ = auVar83._8_4_ + fVar93 * auVar81._8_4_;
                  auVar127._12_4_ = auVar83._12_4_ + fVar95 * auVar81._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar75 + uVar68)),
                                       auVar102);
                  auVar202._0_4_ = auVar102._0_4_ + fVar80 * auVar81._0_4_;
                  auVar202._4_4_ = auVar102._4_4_ + fVar91 * auVar81._4_4_;
                  auVar202._8_4_ = auVar102._8_4_ + fVar93 * auVar81._8_4_;
                  auVar202._12_4_ = auVar102._12_4_ + fVar95 * auVar81._12_4_;
                  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + (uVar68 + lVar66) * lVar11),
                                       auVar113);
                  auVar85._0_4_ = auVar113._0_4_ + auVar81._0_4_ * fVar80;
                  auVar85._4_4_ = auVar113._4_4_ + auVar81._4_4_ * fVar91;
                  auVar85._8_4_ = auVar113._8_4_ + auVar81._8_4_ * fVar93;
                  auVar85._12_4_ = auVar113._12_4_ + auVar81._12_4_ * fVar95;
                  auVar82 = vunpcklps_avx(auVar259,auVar103);
                  auVar81 = vunpckhps_avx(auVar259,auVar103);
                  auVar141 = vunpcklps_avx(auVar114,auVar143);
                  auVar128 = vunpckhps_avx(auVar114,auVar143);
                  auVar123 = vunpcklps_avx(auVar81,auVar128);
                  auVar84 = vunpcklps_avx(auVar82,auVar141);
                  auVar81 = vunpckhps_avx(auVar82,auVar141);
                  auVar141 = vunpcklps_avx(auVar114,auVar159);
                  auVar128 = vunpckhps_avx(auVar114,auVar159);
                  auVar112 = vunpcklps_avx(auVar178,auVar103);
                  auVar82 = vunpckhps_avx(auVar178,auVar103);
                  auVar83 = vunpcklps_avx(auVar128,auVar82);
                  auVar102 = vunpcklps_avx(auVar141,auVar112);
                  auVar128 = vunpckhps_avx(auVar141,auVar112);
                  auVar112 = vunpcklps_avx(auVar103,auVar85);
                  auVar82 = vunpckhps_avx(auVar103,auVar85);
                  auVar113 = vunpcklps_avx(auVar159,auVar202);
                  auVar141 = vunpckhps_avx(auVar159,auVar202);
                  auVar124 = vunpcklps_avx(auVar82,auVar141);
                  auVar125 = vunpcklps_avx(auVar112,auVar113);
                  auVar82 = vunpckhps_avx(auVar112,auVar113);
                  auVar113 = vunpcklps_avx(auVar143,auVar202);
                  auVar141 = vunpckhps_avx(auVar143,auVar202);
                  auVar126 = vunpcklps_avx(auVar103,auVar127);
                  auVar112 = vunpckhps_avx(auVar103,auVar127);
                  auVar112 = vunpcklps_avx(auVar141,auVar112);
                  auVar142 = vunpcklps_avx(auVar113,auVar126);
                  auVar141 = vunpckhps_avx(auVar113,auVar126);
                  auVar167._16_16_ = auVar125;
                  auVar167._0_16_ = auVar84;
                  auVar210._16_16_ = auVar82;
                  auVar210._0_16_ = auVar81;
                  auVar88._16_16_ = auVar124;
                  auVar88._0_16_ = auVar123;
                  auVar181._16_16_ = auVar102;
                  auVar181._0_16_ = auVar102;
                  auVar274._16_16_ = auVar128;
                  auVar274._0_16_ = auVar128;
                  auVar117._16_16_ = auVar83;
                  auVar117._0_16_ = auVar83;
                  auVar133._16_16_ = auVar142;
                  auVar133._0_16_ = auVar142;
                  auVar241._16_16_ = auVar141;
                  auVar241._0_16_ = auVar141;
                  uVar3 = *(undefined4 *)&(local_1710->org).field_0;
                  auVar149._4_4_ = uVar3;
                  auVar149._0_4_ = uVar3;
                  auVar149._8_4_ = uVar3;
                  auVar149._12_4_ = uVar3;
                  auVar149._16_4_ = uVar3;
                  auVar149._20_4_ = uVar3;
                  auVar149._24_4_ = uVar3;
                  auVar149._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)((long)&(local_1710->org).field_0 + 4);
                  auVar255._4_4_ = uVar3;
                  auVar255._0_4_ = uVar3;
                  auVar255._8_4_ = uVar3;
                  auVar255._12_4_ = uVar3;
                  auVar255._16_4_ = uVar3;
                  auVar255._20_4_ = uVar3;
                  auVar255._24_4_ = uVar3;
                  auVar255._28_4_ = uVar3;
                  auVar260._16_16_ = auVar112;
                  auVar260._0_16_ = auVar112;
                  uVar3 = *(undefined4 *)((long)&(local_1710->org).field_0 + 8);
                  auVar263._4_4_ = uVar3;
                  auVar263._0_4_ = uVar3;
                  auVar263._8_4_ = uVar3;
                  auVar263._12_4_ = uVar3;
                  auVar263._16_4_ = uVar3;
                  auVar263._20_4_ = uVar3;
                  auVar263._24_4_ = uVar3;
                  auVar263._28_4_ = uVar3;
                  local_1740 = vsubps_avx(auVar167,auVar149);
                  local_15e0 = vsubps_avx(auVar210,auVar255);
                  local_16e0 = vsubps_avx(auVar88,auVar263);
                  auVar104 = vsubps_avx(auVar181,auVar149);
                  auVar12 = vsubps_avx(auVar274,auVar255);
                  auVar13 = vsubps_avx(auVar117,auVar263);
                  auVar14 = vsubps_avx(auVar133,auVar149);
                  auVar15 = vsubps_avx(auVar241,auVar255);
                  auVar16 = vsubps_avx(auVar260,auVar263);
                  local_14c0 = vsubps_avx(auVar14,local_1740);
                  local_15a0 = vsubps_avx(auVar15,local_15e0);
                  local_1380 = vsubps_avx(auVar16,local_16e0);
                  fVar286 = local_15e0._0_4_;
                  fVar172 = fVar286 + auVar15._0_4_;
                  fVar289 = local_15e0._4_4_;
                  fVar184 = fVar289 + auVar15._4_4_;
                  fVar291 = local_15e0._8_4_;
                  fVar186 = fVar291 + auVar15._8_4_;
                  fVar293 = local_15e0._12_4_;
                  fVar188 = fVar293 + auVar15._12_4_;
                  fVar295 = local_15e0._16_4_;
                  fVar190 = fVar295 + auVar15._16_4_;
                  fVar297 = local_15e0._20_4_;
                  fVar192 = fVar297 + auVar15._20_4_;
                  fVar299 = local_15e0._24_4_;
                  fVar194 = fVar299 + auVar15._24_4_;
                  fVar154 = local_15e0._28_4_;
                  fVar80 = local_16e0._0_4_;
                  fVar196 = auVar16._0_4_ + fVar80;
                  fVar93 = local_16e0._4_4_;
                  fVar213 = auVar16._4_4_ + fVar93;
                  fVar97 = local_16e0._8_4_;
                  fVar215 = auVar16._8_4_ + fVar97;
                  fVar101 = local_16e0._12_4_;
                  fVar217 = auVar16._12_4_ + fVar101;
                  fVar138 = local_16e0._16_4_;
                  fVar219 = auVar16._16_4_ + fVar138;
                  fVar140 = local_16e0._20_4_;
                  fVar221 = auVar16._20_4_ + fVar140;
                  fVar110 = local_16e0._24_4_;
                  fVar223 = auVar16._24_4_ + fVar110;
                  fVar122 = local_16e0._28_4_;
                  fVar79 = local_1380._0_4_;
                  fVar90 = local_1380._4_4_;
                  auVar24._4_4_ = fVar90 * fVar184;
                  auVar24._0_4_ = fVar79 * fVar172;
                  fVar92 = local_1380._8_4_;
                  auVar24._8_4_ = fVar92 * fVar186;
                  fVar94 = local_1380._12_4_;
                  auVar24._12_4_ = fVar94 * fVar188;
                  fVar96 = local_1380._16_4_;
                  auVar24._16_4_ = fVar96 * fVar190;
                  fVar98 = local_1380._20_4_;
                  auVar24._20_4_ = fVar98 * fVar192;
                  fVar100 = local_1380._24_4_;
                  auVar24._24_4_ = fVar100 * fVar194;
                  auVar24._28_4_ = auVar141._12_4_;
                  fVar301 = local_15a0._0_4_;
                  fVar304 = local_15a0._4_4_;
                  auVar25._4_4_ = fVar304 * fVar213;
                  auVar25._0_4_ = fVar301 * fVar196;
                  fVar306 = local_15a0._8_4_;
                  auVar25._8_4_ = fVar306 * fVar215;
                  fVar308 = local_15a0._12_4_;
                  auVar25._12_4_ = fVar308 * fVar217;
                  fVar310 = local_15a0._16_4_;
                  auVar25._16_4_ = fVar310 * fVar219;
                  fVar312 = local_15a0._20_4_;
                  auVar25._20_4_ = fVar312 * fVar221;
                  uVar3 = auVar112._12_4_;
                  fVar314 = local_15a0._24_4_;
                  auVar25._24_4_ = fVar314 * fVar223;
                  auVar25._28_4_ = uVar3;
                  auVar17 = vsubps_avx(auVar25,auVar24);
                  fVar91 = local_1740._0_4_;
                  fVar236 = auVar14._0_4_ + fVar91;
                  fVar95 = local_1740._4_4_;
                  fVar243 = auVar14._4_4_ + fVar95;
                  fVar99 = local_1740._8_4_;
                  fVar244 = auVar14._8_4_ + fVar99;
                  fVar137 = local_1740._12_4_;
                  fVar245 = auVar14._12_4_ + fVar137;
                  fVar139 = local_1740._16_4_;
                  fVar246 = auVar14._16_4_ + fVar139;
                  fVar109 = local_1740._20_4_;
                  fVar247 = auVar14._20_4_ + fVar109;
                  fVar111 = local_1740._24_4_;
                  fVar248 = auVar14._24_4_ + fVar111;
                  fVar262 = local_14c0._0_4_;
                  fVar265 = local_14c0._4_4_;
                  auVar26._4_4_ = fVar265 * fVar213;
                  auVar26._0_4_ = fVar262 * fVar196;
                  fVar266 = local_14c0._8_4_;
                  auVar26._8_4_ = fVar266 * fVar215;
                  fVar267 = local_14c0._12_4_;
                  auVar26._12_4_ = fVar267 * fVar217;
                  fVar268 = local_14c0._16_4_;
                  auVar26._16_4_ = fVar268 * fVar219;
                  fVar269 = local_14c0._20_4_;
                  auVar26._20_4_ = fVar269 * fVar221;
                  fVar270 = local_14c0._24_4_;
                  auVar26._24_4_ = fVar270 * fVar223;
                  auVar26._28_4_ = auVar16._28_4_ + fVar122;
                  auVar27._4_4_ = fVar243 * fVar90;
                  auVar27._0_4_ = fVar236 * fVar79;
                  auVar27._8_4_ = fVar244 * fVar92;
                  auVar27._12_4_ = fVar245 * fVar94;
                  auVar27._16_4_ = fVar246 * fVar96;
                  auVar27._20_4_ = fVar247 * fVar98;
                  auVar27._24_4_ = fVar248 * fVar100;
                  auVar27._28_4_ = uVar3;
                  auVar86 = vsubps_avx(auVar27,auVar26);
                  auVar28._4_4_ = fVar304 * fVar243;
                  auVar28._0_4_ = fVar301 * fVar236;
                  auVar28._8_4_ = fVar306 * fVar244;
                  auVar28._12_4_ = fVar308 * fVar245;
                  auVar28._16_4_ = fVar310 * fVar246;
                  auVar28._20_4_ = fVar312 * fVar247;
                  auVar28._24_4_ = fVar314 * fVar248;
                  auVar28._28_4_ = uVar3;
                  auVar29._4_4_ = fVar265 * fVar184;
                  auVar29._0_4_ = fVar262 * fVar172;
                  auVar29._8_4_ = fVar266 * fVar186;
                  auVar29._12_4_ = fVar267 * fVar188;
                  auVar29._16_4_ = fVar268 * fVar190;
                  auVar29._20_4_ = fVar269 * fVar192;
                  auVar29._24_4_ = fVar270 * fVar194;
                  auVar29._28_4_ = fVar154 + auVar15._28_4_;
                  local_1780._4_4_ = (local_1710->dir).field_0.m128[2];
                  auVar115 = vsubps_avx(auVar29,auVar28);
                  local_17a0._4_4_ = (local_1710->dir).field_0.m128[1];
                  local_17a0._0_4_ = local_17a0._4_4_;
                  fStack_1798 = (float)local_17a0._4_4_;
                  fStack_1794 = (float)local_17a0._4_4_;
                  fStack_1790 = (float)local_17a0._4_4_;
                  fStack_178c = (float)local_17a0._4_4_;
                  fStack_1788 = (float)local_17a0._4_4_;
                  fStack_1784 = (float)local_17a0._4_4_;
                  local_17c0._4_4_ = (local_1710->dir).field_0.m128[0];
                  local_13c0._0_4_ =
                       auVar17._0_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._0_4_ + local_1780._4_4_ * auVar115._0_4_;
                  local_13c0._4_4_ =
                       auVar17._4_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._4_4_ + local_1780._4_4_ * auVar115._4_4_;
                  local_13c0._8_4_ =
                       auVar17._8_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._8_4_ + local_1780._4_4_ * auVar115._8_4_;
                  local_13c0._12_4_ =
                       auVar17._12_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._12_4_ + local_1780._4_4_ * auVar115._12_4_
                  ;
                  local_13c0._16_4_ =
                       auVar17._16_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._16_4_ + local_1780._4_4_ * auVar115._16_4_
                  ;
                  local_13c0._20_4_ =
                       auVar17._20_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._20_4_ + local_1780._4_4_ * auVar115._20_4_
                  ;
                  local_13c0._24_4_ =
                       auVar17._24_4_ * local_17c0._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._24_4_ + local_1780._4_4_ * auVar115._24_4_
                  ;
                  local_13c0._28_4_ = auVar86._28_4_ + auVar86._28_4_ + auVar115._28_4_;
                  local_13a0 = vsubps_avx(local_15e0,auVar12);
                  auVar17 = vsubps_avx(local_16e0,auVar13);
                  fVar184 = fVar286 + auVar12._0_4_;
                  fVar186 = fVar289 + auVar12._4_4_;
                  fVar188 = fVar291 + auVar12._8_4_;
                  fVar190 = fVar293 + auVar12._12_4_;
                  fVar192 = fVar295 + auVar12._16_4_;
                  fVar194 = fVar297 + auVar12._20_4_;
                  fVar196 = fVar299 + auVar12._24_4_;
                  fVar172 = auVar12._28_4_;
                  fVar213 = auVar13._0_4_ + fVar80;
                  fVar215 = auVar13._4_4_ + fVar93;
                  fVar217 = auVar13._8_4_ + fVar97;
                  fVar219 = auVar13._12_4_ + fVar101;
                  fVar221 = auVar13._16_4_ + fVar138;
                  fVar223 = auVar13._20_4_ + fVar140;
                  fVar236 = auVar13._24_4_ + fVar110;
                  fVar302 = auVar17._0_4_;
                  fVar305 = auVar17._4_4_;
                  auVar30._4_4_ = fVar305 * fVar186;
                  auVar30._0_4_ = fVar302 * fVar184;
                  fVar307 = auVar17._8_4_;
                  auVar30._8_4_ = fVar307 * fVar188;
                  fVar309 = auVar17._12_4_;
                  auVar30._12_4_ = fVar309 * fVar190;
                  fVar311 = auVar17._16_4_;
                  auVar30._16_4_ = fVar311 * fVar192;
                  fVar313 = auVar17._20_4_;
                  auVar30._20_4_ = fVar313 * fVar194;
                  fVar315 = auVar17._24_4_;
                  auVar30._24_4_ = fVar315 * fVar196;
                  auVar30._28_4_ = fVar154;
                  fVar271 = local_13a0._0_4_;
                  fVar276 = local_13a0._4_4_;
                  auVar31._4_4_ = fVar276 * fVar215;
                  auVar31._0_4_ = fVar271 * fVar213;
                  fVar278 = local_13a0._8_4_;
                  auVar31._8_4_ = fVar278 * fVar217;
                  fVar280 = local_13a0._12_4_;
                  auVar31._12_4_ = fVar280 * fVar219;
                  fVar282 = local_13a0._16_4_;
                  auVar31._16_4_ = fVar282 * fVar221;
                  fVar284 = local_13a0._20_4_;
                  auVar31._20_4_ = fVar284 * fVar223;
                  fVar285 = local_13a0._24_4_;
                  auVar31._24_4_ = fVar285 * fVar236;
                  auVar31._28_4_ = fVar122;
                  auVar17 = vsubps_avx(auVar31,auVar30);
                  auVar86 = vsubps_avx(local_1740,auVar104);
                  fVar287 = auVar86._0_4_;
                  fVar290 = auVar86._4_4_;
                  auVar32._4_4_ = fVar290 * fVar215;
                  auVar32._0_4_ = fVar287 * fVar213;
                  fVar292 = auVar86._8_4_;
                  auVar32._8_4_ = fVar292 * fVar217;
                  fVar294 = auVar86._12_4_;
                  auVar32._12_4_ = fVar294 * fVar219;
                  fVar296 = auVar86._16_4_;
                  auVar32._16_4_ = fVar296 * fVar221;
                  fVar298 = auVar86._20_4_;
                  auVar32._20_4_ = fVar298 * fVar223;
                  fVar300 = auVar86._24_4_;
                  auVar32._24_4_ = fVar300 * fVar236;
                  auVar32._28_4_ = auVar13._28_4_ + fVar122;
                  fVar213 = auVar104._0_4_ + fVar91;
                  fVar215 = auVar104._4_4_ + fVar95;
                  fVar217 = auVar104._8_4_ + fVar99;
                  fVar219 = auVar104._12_4_ + fVar137;
                  fVar221 = auVar104._16_4_ + fVar139;
                  fVar223 = auVar104._20_4_ + fVar109;
                  fVar236 = auVar104._24_4_ + fVar111;
                  auVar33._4_4_ = fVar305 * fVar215;
                  auVar33._0_4_ = fVar302 * fVar213;
                  auVar33._8_4_ = fVar307 * fVar217;
                  auVar33._12_4_ = fVar309 * fVar219;
                  auVar33._16_4_ = fVar311 * fVar221;
                  auVar33._20_4_ = fVar313 * fVar223;
                  fVar122 = auVar104._28_4_;
                  auVar33._24_4_ = fVar315 * fVar236;
                  auVar33._28_4_ = fVar122;
                  auVar86 = vsubps_avx(auVar33,auVar32);
                  auVar116 = local_13a0;
                  auVar34._4_4_ = fVar276 * fVar215;
                  auVar34._0_4_ = fVar271 * fVar213;
                  auVar34._8_4_ = fVar278 * fVar217;
                  auVar34._12_4_ = fVar280 * fVar219;
                  auVar34._16_4_ = fVar282 * fVar221;
                  auVar34._20_4_ = fVar284 * fVar223;
                  auVar34._24_4_ = fVar285 * fVar236;
                  auVar34._28_4_ = fVar122;
                  auVar35._4_4_ = fVar290 * fVar186;
                  auVar35._0_4_ = fVar287 * fVar184;
                  auVar35._8_4_ = fVar292 * fVar188;
                  auVar35._12_4_ = fVar294 * fVar190;
                  auVar35._16_4_ = fVar296 * fVar192;
                  auVar35._20_4_ = fVar298 * fVar194;
                  auVar35._24_4_ = fVar300 * fVar196;
                  auVar35._28_4_ = fVar154 + fVar172;
                  auVar115 = vsubps_avx(auVar35,auVar34);
                  fVar184 = auVar17._28_4_;
                  local_13e0._0_4_ =
                       local_17c0._4_4_ * auVar17._0_4_ +
                       (float)local_17a0._4_4_ * auVar86._0_4_ + local_1780._4_4_ * auVar115._0_4_;
                  local_13e0._4_4_ =
                       local_17c0._4_4_ * auVar17._4_4_ +
                       (float)local_17a0._4_4_ * auVar86._4_4_ + local_1780._4_4_ * auVar115._4_4_;
                  local_13e0._8_4_ =
                       local_17c0._4_4_ * auVar17._8_4_ +
                       (float)local_17a0._4_4_ * auVar86._8_4_ + local_1780._4_4_ * auVar115._8_4_;
                  local_13e0._12_4_ =
                       local_17c0._4_4_ * auVar17._12_4_ +
                       (float)local_17a0._4_4_ * auVar86._12_4_ + local_1780._4_4_ * auVar115._12_4_
                  ;
                  local_13e0._16_4_ =
                       local_17c0._4_4_ * auVar17._16_4_ +
                       (float)local_17a0._4_4_ * auVar86._16_4_ + local_1780._4_4_ * auVar115._16_4_
                  ;
                  local_13e0._20_4_ =
                       local_17c0._4_4_ * auVar17._20_4_ +
                       (float)local_17a0._4_4_ * auVar86._20_4_ + local_1780._4_4_ * auVar115._20_4_
                  ;
                  local_13e0._24_4_ =
                       local_17c0._4_4_ * auVar17._24_4_ +
                       (float)local_17a0._4_4_ * auVar86._24_4_ + local_1780._4_4_ * auVar115._24_4_
                  ;
                  local_13e0._28_4_ = fVar184 + auVar86._28_4_ + auVar115._28_4_;
                  auVar17 = vsubps_avx(auVar104,auVar14);
                  fVar244 = auVar104._0_4_ + auVar14._0_4_;
                  fVar245 = auVar104._4_4_ + auVar14._4_4_;
                  fVar246 = auVar104._8_4_ + auVar14._8_4_;
                  fVar247 = auVar104._12_4_ + auVar14._12_4_;
                  fVar248 = auVar104._16_4_ + auVar14._16_4_;
                  fVar154 = auVar104._20_4_ + auVar14._20_4_;
                  fVar155 = auVar104._24_4_ + auVar14._24_4_;
                  auVar104 = vsubps_avx(auVar12,auVar15);
                  fVar215 = auVar12._0_4_ + auVar15._0_4_;
                  fVar217 = auVar12._4_4_ + auVar15._4_4_;
                  fVar219 = auVar12._8_4_ + auVar15._8_4_;
                  fVar221 = auVar12._12_4_ + auVar15._12_4_;
                  fVar223 = auVar12._16_4_ + auVar15._16_4_;
                  fVar236 = auVar12._20_4_ + auVar15._20_4_;
                  fVar243 = auVar12._24_4_ + auVar15._24_4_;
                  auVar12 = vsubps_avx(auVar13,auVar16);
                  fVar186 = auVar13._0_4_ + auVar16._0_4_;
                  fVar188 = auVar13._4_4_ + auVar16._4_4_;
                  fVar190 = auVar13._8_4_ + auVar16._8_4_;
                  fVar192 = auVar13._12_4_ + auVar16._12_4_;
                  fVar194 = auVar13._16_4_ + auVar16._16_4_;
                  fVar196 = auVar13._20_4_ + auVar16._20_4_;
                  fVar213 = auVar13._24_4_ + auVar16._24_4_;
                  fVar173 = auVar12._0_4_;
                  fVar185 = auVar12._4_4_;
                  auVar36._4_4_ = fVar185 * fVar217;
                  auVar36._0_4_ = fVar173 * fVar215;
                  fVar187 = auVar12._8_4_;
                  auVar36._8_4_ = fVar187 * fVar219;
                  fVar189 = auVar12._12_4_;
                  auVar36._12_4_ = fVar189 * fVar221;
                  fVar191 = auVar12._16_4_;
                  auVar36._16_4_ = fVar191 * fVar223;
                  fVar193 = auVar12._20_4_;
                  auVar36._20_4_ = fVar193 * fVar236;
                  fVar195 = auVar12._24_4_;
                  auVar36._24_4_ = fVar195 * fVar243;
                  auVar36._28_4_ = fVar172;
                  fVar197 = auVar104._0_4_;
                  fVar214 = auVar104._4_4_;
                  auVar37._4_4_ = fVar214 * fVar188;
                  auVar37._0_4_ = fVar197 * fVar186;
                  fVar216 = auVar104._8_4_;
                  auVar37._8_4_ = fVar216 * fVar190;
                  fVar218 = auVar104._12_4_;
                  auVar37._12_4_ = fVar218 * fVar192;
                  fVar220 = auVar104._16_4_;
                  auVar37._16_4_ = fVar220 * fVar194;
                  fVar222 = auVar104._20_4_;
                  auVar37._20_4_ = fVar222 * fVar196;
                  fVar224 = auVar104._24_4_;
                  auVar37._24_4_ = fVar224 * fVar213;
                  auVar37._28_4_ = fVar184;
                  auVar104 = vsubps_avx(auVar37,auVar36);
                  fVar272 = auVar17._0_4_;
                  fVar277 = auVar17._4_4_;
                  auVar38._4_4_ = fVar277 * fVar188;
                  auVar38._0_4_ = fVar272 * fVar186;
                  fVar279 = auVar17._8_4_;
                  auVar38._8_4_ = fVar279 * fVar190;
                  fVar281 = auVar17._12_4_;
                  auVar38._12_4_ = fVar281 * fVar192;
                  fVar283 = auVar17._16_4_;
                  auVar38._16_4_ = fVar283 * fVar194;
                  fVar194 = auVar17._20_4_;
                  auVar38._20_4_ = fVar194 * fVar196;
                  fVar196 = auVar17._24_4_;
                  auVar38._24_4_ = fVar196 * fVar213;
                  auVar38._28_4_ = auVar13._28_4_ + auVar16._28_4_;
                  auVar39._4_4_ = fVar185 * fVar245;
                  auVar39._0_4_ = fVar173 * fVar244;
                  auVar39._8_4_ = fVar187 * fVar246;
                  auVar39._12_4_ = fVar189 * fVar247;
                  auVar39._16_4_ = fVar191 * fVar248;
                  auVar39._20_4_ = fVar193 * fVar154;
                  auVar39._24_4_ = fVar195 * fVar155;
                  auVar39._28_4_ = fVar184;
                  auVar12 = vsubps_avx(auVar39,auVar38);
                  auVar40._4_4_ = fVar214 * fVar245;
                  auVar40._0_4_ = fVar197 * fVar244;
                  auVar40._8_4_ = fVar216 * fVar246;
                  auVar40._12_4_ = fVar218 * fVar247;
                  auVar40._16_4_ = fVar220 * fVar248;
                  auVar40._20_4_ = fVar222 * fVar154;
                  auVar40._24_4_ = fVar224 * fVar155;
                  auVar40._28_4_ = fVar122 + auVar14._28_4_;
                  auVar41._4_4_ = fVar277 * fVar217;
                  auVar41._0_4_ = fVar272 * fVar215;
                  auVar41._8_4_ = fVar279 * fVar219;
                  auVar41._12_4_ = fVar281 * fVar221;
                  auVar41._16_4_ = fVar283 * fVar223;
                  auVar41._20_4_ = fVar194 * fVar236;
                  auVar41._24_4_ = fVar196 * fVar243;
                  auVar41._28_4_ = fVar172 + auVar15._28_4_;
                  auVar13 = vsubps_avx(auVar41,auVar40);
                  local_1780._0_4_ = local_1780._4_4_;
                  fStack_1778 = local_1780._4_4_;
                  fStack_1774 = local_1780._4_4_;
                  fStack_1770 = local_1780._4_4_;
                  fStack_176c = local_1780._4_4_;
                  fStack_1768 = local_1780._4_4_;
                  fStack_1764 = local_1780._4_4_;
                  local_17c0._0_4_ = local_17c0._4_4_;
                  fStack_17b8 = local_17c0._4_4_;
                  fStack_17b4 = local_17c0._4_4_;
                  fStack_17b0 = local_17c0._4_4_;
                  fStack_17ac = local_17c0._4_4_;
                  fStack_17a8 = local_17c0._4_4_;
                  fStack_17a4 = local_17c0._4_4_;
                  auVar106._0_4_ =
                       local_17c0._4_4_ * auVar104._0_4_ +
                       (float)local_17a0._4_4_ * auVar12._0_4_ + local_1780._4_4_ * auVar13._0_4_;
                  auVar106._4_4_ =
                       local_17c0._4_4_ * auVar104._4_4_ +
                       (float)local_17a0._4_4_ * auVar12._4_4_ + local_1780._4_4_ * auVar13._4_4_;
                  auVar106._8_4_ =
                       local_17c0._4_4_ * auVar104._8_4_ +
                       (float)local_17a0._4_4_ * auVar12._8_4_ + local_1780._4_4_ * auVar13._8_4_;
                  auVar106._12_4_ =
                       local_17c0._4_4_ * auVar104._12_4_ +
                       (float)local_17a0._4_4_ * auVar12._12_4_ + local_1780._4_4_ * auVar13._12_4_;
                  auVar106._16_4_ =
                       local_17c0._4_4_ * auVar104._16_4_ +
                       (float)local_17a0._4_4_ * auVar12._16_4_ + local_1780._4_4_ * auVar13._16_4_;
                  auVar106._20_4_ =
                       local_17c0._4_4_ * auVar104._20_4_ +
                       (float)local_17a0._4_4_ * auVar12._20_4_ + local_1780._4_4_ * auVar13._20_4_;
                  auVar106._24_4_ =
                       local_17c0._4_4_ * auVar104._24_4_ +
                       (float)local_17a0._4_4_ * auVar12._24_4_ + local_1780._4_4_ * auVar13._24_4_;
                  auVar106._28_4_ = auVar104._28_4_ + auVar12._28_4_ + auVar13._28_4_;
                  local_1320._0_4_ = auVar106._0_4_ + local_13c0._0_4_ + local_13e0._0_4_;
                  local_1320._4_4_ = auVar106._4_4_ + local_13c0._4_4_ + local_13e0._4_4_;
                  local_1320._8_4_ = auVar106._8_4_ + local_13c0._8_4_ + local_13e0._8_4_;
                  local_1320._12_4_ = auVar106._12_4_ + local_13c0._12_4_ + local_13e0._12_4_;
                  local_1320._16_4_ = auVar106._16_4_ + local_13c0._16_4_ + local_13e0._16_4_;
                  local_1320._20_4_ = auVar106._20_4_ + local_13c0._20_4_ + local_13e0._20_4_;
                  local_1320._24_4_ = auVar106._24_4_ + local_13c0._24_4_ + local_13e0._24_4_;
                  local_1320._28_4_ = auVar106._28_4_ + local_13c0._28_4_ + local_13e0._28_4_;
                  auVar104 = vminps_avx(local_13c0,local_13e0);
                  auVar104 = vminps_avx(auVar104,auVar106);
                  auVar134._8_4_ = 0x7fffffff;
                  auVar134._0_8_ = 0x7fffffff7fffffff;
                  auVar134._12_4_ = 0x7fffffff;
                  auVar134._16_4_ = 0x7fffffff;
                  auVar134._20_4_ = 0x7fffffff;
                  auVar134._24_4_ = 0x7fffffff;
                  auVar134._28_4_ = 0x7fffffff;
                  local_1480 = vandps_avx(local_1320,auVar134);
                  fVar122 = local_1480._0_4_ * 1.1920929e-07;
                  fVar172 = local_1480._4_4_ * 1.1920929e-07;
                  auVar42._4_4_ = fVar172;
                  auVar42._0_4_ = fVar122;
                  fVar184 = local_1480._8_4_ * 1.1920929e-07;
                  auVar42._8_4_ = fVar184;
                  fVar186 = local_1480._12_4_ * 1.1920929e-07;
                  auVar42._12_4_ = fVar186;
                  fVar188 = local_1480._16_4_ * 1.1920929e-07;
                  auVar42._16_4_ = fVar188;
                  fVar190 = local_1480._20_4_ * 1.1920929e-07;
                  auVar42._20_4_ = fVar190;
                  fVar192 = local_1480._24_4_ * 1.1920929e-07;
                  auVar42._24_4_ = fVar192;
                  auVar42._28_4_ = 0x34000000;
                  auVar136 = ZEXT3264(auVar42);
                  auVar150._0_8_ = CONCAT44(fVar172,fVar122) ^ 0x8000000080000000;
                  auVar150._8_4_ = -fVar184;
                  auVar150._12_4_ = -fVar186;
                  auVar150._16_4_ = -fVar188;
                  auVar150._20_4_ = -fVar190;
                  auVar150._24_4_ = -fVar192;
                  auVar150._28_4_ = 0xb4000000;
                  auVar104 = vcmpps_avx(auVar104,auVar150,5);
                  auVar121 = ZEXT3264(auVar104);
                  auVar13 = vmaxps_avx(local_13c0,local_13e0);
                  auVar153 = ZEXT3264(auVar13);
                  auVar12 = vmaxps_avx(auVar13,auVar106);
                  auVar12 = vcmpps_avx(auVar12,auVar42,2);
                  auVar108 = ZEXT3264(auVar12);
                  local_1400 = vorps_avx(auVar104,auVar12);
                  local_1300 = &local_1819;
                  auVar14 = local_14a0 & local_1400;
                  uVar61 = local_1818;
                  uVar68 = local_17f0;
                  uVar69 = local_17f8;
                  uVar71 = local_1800;
                  uVar72 = local_1808;
                  uVar73 = local_1810;
                  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar14 >> 0x7f,0) == '\0') &&
                        (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar14 >> 0xbf,0) == '\0') &&
                      (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar14[0x1f]) {
LAB_00315ac4:
                    auVar303 = ZEXT3264(local_1600);
                    auVar275 = ZEXT3264(local_1680);
                    auVar288 = ZEXT3264(local_16a0);
                    auVar264 = ZEXT3264(local_16c0);
                    auVar171 = ZEXT3264(local_15c0);
                  }
                  else {
                    auVar43._4_4_ = fVar90 * fVar276;
                    auVar43._0_4_ = fVar79 * fVar271;
                    auVar43._8_4_ = fVar92 * fVar278;
                    auVar43._12_4_ = fVar94 * fVar280;
                    auVar43._16_4_ = fVar96 * fVar282;
                    auVar43._20_4_ = fVar98 * fVar284;
                    auVar43._24_4_ = fVar100 * fVar285;
                    auVar43._28_4_ = auVar12._28_4_;
                    auVar44._4_4_ = fVar304 * fVar305;
                    auVar44._0_4_ = fVar301 * fVar302;
                    auVar44._8_4_ = fVar306 * fVar307;
                    auVar44._12_4_ = fVar308 * fVar309;
                    auVar44._16_4_ = fVar310 * fVar311;
                    auVar44._20_4_ = fVar312 * fVar313;
                    auVar44._24_4_ = fVar314 * fVar315;
                    auVar44._28_4_ = auVar104._28_4_;
                    auVar14 = vsubps_avx(auVar44,auVar43);
                    auVar45._4_4_ = fVar305 * fVar214;
                    auVar45._0_4_ = fVar302 * fVar197;
                    auVar45._8_4_ = fVar307 * fVar216;
                    auVar45._12_4_ = fVar309 * fVar218;
                    auVar45._16_4_ = fVar311 * fVar220;
                    auVar45._20_4_ = fVar313 * fVar222;
                    auVar45._24_4_ = fVar315 * fVar224;
                    auVar45._28_4_ = 0x34000000;
                    auVar46._4_4_ = fVar276 * fVar185;
                    auVar46._0_4_ = fVar271 * fVar173;
                    auVar46._8_4_ = fVar278 * fVar187;
                    auVar46._12_4_ = fVar280 * fVar189;
                    auVar46._16_4_ = fVar282 * fVar191;
                    auVar46._20_4_ = fVar284 * fVar193;
                    auVar46._24_4_ = fVar285 * fVar195;
                    auVar46._28_4_ = auVar13._28_4_;
                    auVar15 = vsubps_avx(auVar46,auVar45);
                    auVar168._8_4_ = 0x7fffffff;
                    auVar168._0_8_ = 0x7fffffff7fffffff;
                    auVar168._12_4_ = 0x7fffffff;
                    auVar168._16_4_ = 0x7fffffff;
                    auVar168._20_4_ = 0x7fffffff;
                    auVar168._24_4_ = 0x7fffffff;
                    auVar168._28_4_ = 0x7fffffff;
                    auVar104 = vandps_avx(auVar43,auVar168);
                    auVar12 = vandps_avx(auVar45,auVar168);
                    auVar104 = vcmpps_avx(auVar104,auVar12,1);
                    auVar13 = vblendvps_avx(auVar15,auVar14,auVar104);
                    auVar108 = ZEXT3264(auVar13);
                    auVar47._4_4_ = fVar290 * fVar185;
                    auVar47._0_4_ = fVar287 * fVar173;
                    auVar47._8_4_ = fVar292 * fVar187;
                    auVar47._12_4_ = fVar294 * fVar189;
                    auVar47._16_4_ = fVar296 * fVar191;
                    auVar47._20_4_ = fVar298 * fVar193;
                    auVar47._24_4_ = fVar300 * fVar195;
                    auVar47._28_4_ = auVar14._28_4_;
                    auVar48._4_4_ = fVar90 * fVar290;
                    auVar48._0_4_ = fVar79 * fVar287;
                    auVar48._8_4_ = fVar92 * fVar292;
                    auVar48._12_4_ = fVar94 * fVar294;
                    auVar48._16_4_ = fVar96 * fVar296;
                    auVar48._20_4_ = fVar98 * fVar298;
                    auVar48._24_4_ = fVar100 * fVar300;
                    auVar48._28_4_ = auVar12._28_4_;
                    auVar49._4_4_ = fVar265 * fVar305;
                    auVar49._0_4_ = fVar262 * fVar302;
                    auVar49._8_4_ = fVar266 * fVar307;
                    auVar49._12_4_ = fVar267 * fVar309;
                    auVar49._16_4_ = fVar268 * fVar311;
                    auVar49._20_4_ = fVar269 * fVar313;
                    auVar49._24_4_ = fVar270 * fVar315;
                    auVar49._28_4_ = auVar15._28_4_;
                    auVar15 = vsubps_avx(auVar48,auVar49);
                    auVar50._4_4_ = fVar305 * fVar277;
                    auVar50._0_4_ = fVar302 * fVar272;
                    auVar50._8_4_ = fVar307 * fVar279;
                    auVar50._12_4_ = fVar309 * fVar281;
                    auVar50._16_4_ = fVar311 * fVar283;
                    auVar50._20_4_ = fVar313 * fVar194;
                    auVar50._24_4_ = fVar315 * fVar196;
                    auVar50._28_4_ = 0x7fffffff;
                    auVar14 = vsubps_avx(auVar50,auVar47);
                    auVar104 = vandps_avx(auVar168,auVar49);
                    auVar12 = vandps_avx(auVar168,auVar47);
                    auVar12 = vcmpps_avx(auVar104,auVar12,1);
                    auVar14 = vblendvps_avx(auVar14,auVar15,auVar12);
                    auVar51._4_4_ = fVar277 * fVar276;
                    auVar51._0_4_ = fVar272 * fVar271;
                    auVar51._8_4_ = fVar279 * fVar278;
                    auVar51._12_4_ = fVar281 * fVar280;
                    auVar51._16_4_ = fVar283 * fVar282;
                    auVar51._20_4_ = fVar194 * fVar284;
                    auVar51._24_4_ = fVar196 * fVar285;
                    auVar51._28_4_ = auVar12._28_4_;
                    auVar52._4_4_ = fVar265 * fVar276;
                    auVar52._0_4_ = fVar262 * fVar271;
                    auVar52._8_4_ = fVar266 * fVar278;
                    auVar52._12_4_ = fVar267 * fVar280;
                    auVar52._16_4_ = fVar268 * fVar282;
                    auVar52._20_4_ = fVar269 * fVar284;
                    auVar52._24_4_ = fVar270 * fVar285;
                    auVar52._28_4_ = auVar15._28_4_;
                    auVar53._4_4_ = fVar304 * fVar290;
                    auVar53._0_4_ = fVar301 * fVar287;
                    auVar53._8_4_ = fVar306 * fVar292;
                    auVar53._12_4_ = fVar308 * fVar294;
                    auVar53._16_4_ = fVar310 * fVar296;
                    auVar53._20_4_ = fVar312 * fVar298;
                    auVar53._24_4_ = fVar314 * fVar300;
                    auVar53._28_4_ = auVar104._28_4_;
                    auVar54._4_4_ = fVar290 * fVar214;
                    auVar54._0_4_ = fVar287 * fVar197;
                    auVar54._8_4_ = fVar292 * fVar216;
                    auVar54._12_4_ = fVar294 * fVar218;
                    auVar54._16_4_ = fVar296 * fVar220;
                    auVar54._20_4_ = fVar298 * fVar222;
                    auVar54._24_4_ = fVar300 * fVar224;
                    auVar54._28_4_ = local_13a0._28_4_;
                    auVar16 = vsubps_avx(auVar52,auVar53);
                    auVar86 = vsubps_avx(auVar54,auVar51);
                    auVar104 = vandps_avx(auVar168,auVar53);
                    auVar12 = vandps_avx(auVar168,auVar51);
                    auVar15 = vcmpps_avx(auVar104,auVar12,1);
                    auVar12 = vblendvps_avx(auVar86,auVar16,auVar15);
                    fVar122 = auVar12._0_4_;
                    fVar172 = auVar12._4_4_;
                    fVar184 = auVar12._8_4_;
                    fVar79 = auVar12._12_4_;
                    fVar90 = auVar12._16_4_;
                    fVar92 = auVar12._20_4_;
                    fVar94 = auVar12._24_4_;
                    fVar236 = auVar14._0_4_;
                    fVar243 = auVar14._4_4_;
                    fVar244 = auVar14._8_4_;
                    fVar245 = auVar14._12_4_;
                    fVar246 = auVar14._16_4_;
                    fVar247 = auVar14._20_4_;
                    fVar248 = auVar14._24_4_;
                    fVar96 = auVar13._0_4_;
                    fVar98 = auVar13._4_4_;
                    fVar100 = auVar13._8_4_;
                    fVar186 = auVar13._12_4_;
                    fVar188 = auVar13._16_4_;
                    fVar190 = auVar13._20_4_;
                    fVar192 = auVar13._24_4_;
                    fVar194 = fVar96 * local_17c0._4_4_ +
                              fVar236 * (float)local_17a0._4_4_ + fVar122 * local_1780._4_4_;
                    fVar196 = fVar98 * local_17c0._4_4_ +
                              fVar243 * (float)local_17a0._4_4_ + fVar172 * local_1780._4_4_;
                    fVar213 = fVar100 * local_17c0._4_4_ +
                              fVar244 * (float)local_17a0._4_4_ + fVar184 * local_1780._4_4_;
                    fVar215 = fVar186 * local_17c0._4_4_ +
                              fVar245 * (float)local_17a0._4_4_ + fVar79 * local_1780._4_4_;
                    fVar217 = fVar188 * local_17c0._4_4_ +
                              fVar246 * (float)local_17a0._4_4_ + fVar90 * local_1780._4_4_;
                    fVar219 = fVar190 * local_17c0._4_4_ +
                              fVar247 * (float)local_17a0._4_4_ + fVar92 * local_1780._4_4_;
                    fVar221 = fVar192 * local_17c0._4_4_ +
                              fVar248 * (float)local_17a0._4_4_ + fVar94 * local_1780._4_4_;
                    fVar223 = auVar16._28_4_ + auVar16._28_4_ + auVar15._28_4_;
                    auVar118._0_4_ = fVar194 + fVar194;
                    auVar118._4_4_ = fVar196 + fVar196;
                    auVar118._8_4_ = fVar213 + fVar213;
                    auVar118._12_4_ = fVar215 + fVar215;
                    auVar118._16_4_ = fVar217 + fVar217;
                    auVar118._20_4_ = fVar219 + fVar219;
                    auVar118._24_4_ = fVar221 + fVar221;
                    auVar118._28_4_ = fVar223 + fVar223;
                    auVar14 = vrcpps_avx(auVar118);
                    fVar194 = fVar96 * fVar91 + fVar236 * fVar286 + fVar122 * fVar80;
                    fVar196 = fVar98 * fVar95 + fVar243 * fVar289 + fVar172 * fVar93;
                    fVar213 = fVar100 * fVar99 + fVar244 * fVar291 + fVar184 * fVar97;
                    fVar137 = fVar186 * fVar137 + fVar245 * fVar293 + fVar79 * fVar101;
                    fVar138 = fVar188 * fVar139 + fVar246 * fVar295 + fVar90 * fVar138;
                    fVar139 = fVar190 * fVar109 + fVar247 * fVar297 + fVar92 * fVar140;
                    fVar140 = fVar192 * fVar111 + fVar248 * fVar299 + fVar94 * fVar110;
                    fVar80 = auVar14._0_4_;
                    fVar91 = auVar14._4_4_;
                    auVar55._4_4_ = auVar118._4_4_ * fVar91;
                    auVar55._0_4_ = auVar118._0_4_ * fVar80;
                    fVar93 = auVar14._8_4_;
                    auVar55._8_4_ = auVar118._8_4_ * fVar93;
                    fVar95 = auVar14._12_4_;
                    auVar55._12_4_ = auVar118._12_4_ * fVar95;
                    fVar97 = auVar14._16_4_;
                    auVar55._16_4_ = auVar118._16_4_ * fVar97;
                    fVar99 = auVar14._20_4_;
                    auVar55._20_4_ = auVar118._20_4_ * fVar99;
                    fVar101 = auVar14._24_4_;
                    auVar55._24_4_ = auVar118._24_4_ * fVar101;
                    auVar55._28_4_ = auVar104._28_4_;
                    auVar211._8_4_ = 0x3f800000;
                    auVar211._0_8_ = &DAT_3f8000003f800000;
                    auVar211._12_4_ = 0x3f800000;
                    auVar211._16_4_ = 0x3f800000;
                    auVar211._20_4_ = 0x3f800000;
                    auVar211._24_4_ = 0x3f800000;
                    auVar211._28_4_ = 0x3f800000;
                    auVar104 = vsubps_avx(auVar211,auVar55);
                    uVar3 = *(undefined4 *)((long)&(local_1710->org).field_0 + 0xc);
                    auVar169._4_4_ = uVar3;
                    auVar169._0_4_ = uVar3;
                    auVar169._8_4_ = uVar3;
                    auVar169._12_4_ = uVar3;
                    auVar169._16_4_ = uVar3;
                    auVar169._20_4_ = uVar3;
                    auVar169._24_4_ = uVar3;
                    auVar169._28_4_ = uVar3;
                    local_1280._4_4_ = (fVar196 + fVar196) * (fVar91 + fVar91 * auVar104._4_4_);
                    local_1280._0_4_ = (fVar194 + fVar194) * (fVar80 + fVar80 * auVar104._0_4_);
                    local_1280._8_4_ = (fVar213 + fVar213) * (fVar93 + fVar93 * auVar104._8_4_);
                    local_1280._12_4_ = (fVar137 + fVar137) * (fVar95 + fVar95 * auVar104._12_4_);
                    local_1280._16_4_ = (fVar138 + fVar138) * (fVar97 + fVar97 * auVar104._16_4_);
                    local_1280._20_4_ = (fVar139 + fVar139) * (fVar99 + fVar99 * auVar104._20_4_);
                    local_1280._24_4_ = (fVar140 + fVar140) * (fVar101 + fVar101 * auVar104._24_4_);
                    local_1280._28_4_ = auVar14._28_4_ + auVar104._28_4_;
                    auVar153 = ZEXT3264(local_1280);
                    auVar104 = vcmpps_avx(auVar169,local_1280,2);
                    fVar80 = local_1710->tfar;
                    auVar170._4_4_ = fVar80;
                    auVar170._0_4_ = fVar80;
                    auVar170._8_4_ = fVar80;
                    auVar170._12_4_ = fVar80;
                    auVar170._16_4_ = fVar80;
                    auVar170._20_4_ = fVar80;
                    auVar170._24_4_ = fVar80;
                    auVar170._28_4_ = fVar80;
                    auVar14 = vcmpps_avx(local_1280,auVar170,2);
                    auVar104 = vandps_avx(auVar104,auVar14);
                    auVar14 = vcmpps_avx(auVar118,_DAT_02020f00,4);
                    auVar104 = vandps_avx(auVar14,auVar104);
                    auVar81 = vpslld_avx(auVar104._0_16_,0x1f);
                    auVar128 = vpsrad_avx(auVar81,0x1f);
                    auVar81 = vpslld_avx(auVar104._16_16_,0x1f);
                    auVar81 = vpsrad_avx(auVar81,0x1f);
                    auVar119._16_16_ = auVar81;
                    auVar119._0_16_ = auVar128;
                    auVar121 = ZEXT3264(auVar119);
                    auVar104 = vandps_avx(local_1400,local_14a0);
                    auVar136 = ZEXT3264(auVar104);
                    auVar14 = auVar104 & auVar119;
                    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar14 >> 0x7f,0) == '\0') &&
                          (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar14 >> 0xbf,0) == '\0') &&
                        (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar14[0x1f]) goto LAB_00315ac4;
                    local_12e0 = vandps_avx(auVar119,auVar104);
                    local_1300 = &local_1819;
                    auVar104 = vsubps_avx(local_1320,local_13e0);
                    auVar104 = vblendvps_avx(local_13c0,auVar104,local_1460);
                    auVar14 = vsubps_avx(local_1320,local_13c0);
                    auVar14 = vblendvps_avx(local_13e0,auVar14,local_1460);
                    auVar151._8_4_ = 0xbf800000;
                    auVar151._0_8_ = 0xbf800000bf800000;
                    auVar151._12_4_ = 0xbf800000;
                    auVar151._16_4_ = 0xbf800000;
                    auVar151._20_4_ = 0xbf800000;
                    auVar151._24_4_ = 0xbf800000;
                    auVar151._28_4_ = 0xbf800000;
                    auVar182._8_4_ = 0x3f800000;
                    auVar182._0_8_ = &DAT_3f8000003f800000;
                    auVar182._12_4_ = 0x3f800000;
                    auVar182._16_4_ = 0x3f800000;
                    auVar182._20_4_ = 0x3f800000;
                    auVar182._24_4_ = 0x3f800000;
                    auVar182._28_4_ = 0x3f800000;
                    auVar15 = vblendvps_avx(auVar182,auVar151,local_1460);
                    fVar80 = auVar15._0_4_;
                    fVar91 = auVar15._4_4_;
                    fVar93 = auVar15._8_4_;
                    fVar95 = auVar15._12_4_;
                    fVar97 = auVar15._16_4_;
                    fVar99 = auVar15._20_4_;
                    fVar101 = auVar15._24_4_;
                    local_1260[0] = fVar80 * fVar96;
                    local_1260[1] = fVar91 * fVar98;
                    local_1260[2] = fVar93 * fVar100;
                    local_1260[3] = fVar95 * fVar186;
                    fStack_1250 = fVar97 * fVar188;
                    fStack_124c = fVar99 * fVar190;
                    fStack_1248 = fVar101 * fVar192;
                    uStack_1244 = auVar13._28_4_;
                    local_1240[0] = fVar236 * fVar80;
                    local_1240[1] = fVar243 * fVar91;
                    local_1240[2] = fVar244 * fVar93;
                    local_1240[3] = fVar245 * fVar95;
                    fStack_1230 = fVar246 * fVar97;
                    fStack_122c = fVar247 * fVar99;
                    fStack_1228 = fVar248 * fVar101;
                    uStack_1224 = auVar13._28_4_;
                    local_1220[0] = fVar80 * fVar122;
                    local_1220[1] = fVar91 * fVar172;
                    local_1220[2] = fVar93 * fVar184;
                    local_1220[3] = fVar95 * fVar79;
                    fStack_1210 = fVar97 * fVar90;
                    fStack_120c = fVar99 * fVar92;
                    fStack_1208 = fVar101 * fVar94;
                    uStack_1204 = auVar12._28_4_;
                    auVar81 = vpshufd_avx(ZEXT416(local_17d8),0);
                    auVar81 = vpaddd_avx(auVar81,_DAT_0201c990);
                    auVar144._0_4_ = (float)(int)(*(ushort *)(local_16f0 + 8 + local_16f8) - 1);
                    auVar144._4_12_ = auVar17._4_12_;
                    auVar128 = vpshufd_avx(ZEXT416(local_17dc),0);
                    auVar128 = vpaddd_avx(auVar128,_DAT_0201c9a0);
                    auVar82 = vrcpss_avx(auVar144,auVar144);
                    fVar80 = auVar82._0_4_ * (2.0 - auVar82._0_4_ * auVar144._0_4_);
                    auVar153 = ZEXT464((uint)fVar80);
                    auVar160._0_4_ = (float)(int)(*(ushort *)(local_16f0 + 10 + local_16f8) - 1);
                    auVar160._4_12_ = auVar17._4_12_;
                    auVar82 = vrcpss_avx(auVar160,auVar160);
                    auVar89._16_16_ = auVar81;
                    auVar89._0_16_ = auVar81;
                    auVar12 = vcvtdq2ps_avx(auVar89);
                    fVar137 = auVar12._28_4_ + auVar104._28_4_;
                    auVar81 = vshufps_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),0);
                    auVar136 = ZEXT3264(CONCAT1616(auVar81,auVar81));
                    fVar80 = (local_1320._0_4_ * auVar12._0_4_ + auVar104._0_4_) * auVar81._0_4_;
                    fVar91 = (local_1320._4_4_ * auVar12._4_4_ + auVar104._4_4_) * auVar81._4_4_;
                    local_1360._4_4_ = fVar91;
                    local_1360._0_4_ = fVar80;
                    fVar93 = (local_1320._8_4_ * auVar12._8_4_ + auVar104._8_4_) * auVar81._8_4_;
                    local_1360._8_4_ = fVar93;
                    fVar95 = (local_1320._12_4_ * auVar12._12_4_ + auVar104._12_4_) * auVar81._12_4_
                    ;
                    local_1360._12_4_ = fVar95;
                    fVar97 = (local_1320._16_4_ * auVar12._16_4_ + auVar104._16_4_) * auVar81._0_4_;
                    local_1360._16_4_ = fVar97;
                    fVar99 = (local_1320._20_4_ * auVar12._20_4_ + auVar104._20_4_) * auVar81._4_4_;
                    local_1360._20_4_ = fVar99;
                    fVar101 = (local_1320._24_4_ * auVar12._24_4_ + auVar104._24_4_) * auVar81._8_4_
                    ;
                    local_1360._24_4_ = fVar101;
                    local_1360._28_4_ = fVar137;
                    auVar107._16_16_ = auVar128;
                    auVar107._0_16_ = auVar128;
                    auVar104 = vcvtdq2ps_avx(auVar107);
                    auVar128 = ZEXT416((uint)(auVar82._0_4_ * (2.0 - auVar82._0_4_ * auVar160._0_4_)
                                             ));
                    auVar128 = vshufps_avx(auVar128,auVar128,0);
                    auVar121 = ZEXT3264(CONCAT1616(auVar128,auVar128));
                    fVar138 = (local_1320._0_4_ * auVar104._0_4_ + auVar14._0_4_) * auVar128._0_4_;
                    fVar139 = (local_1320._4_4_ * auVar104._4_4_ + auVar14._4_4_) * auVar128._4_4_;
                    local_1340._4_4_ = fVar139;
                    local_1340._0_4_ = fVar138;
                    fVar140 = (local_1320._8_4_ * auVar104._8_4_ + auVar14._8_4_) * auVar128._8_4_;
                    local_1340._8_4_ = fVar140;
                    fVar109 = (local_1320._12_4_ * auVar104._12_4_ + auVar14._12_4_) *
                              auVar128._12_4_;
                    local_1340._12_4_ = fVar109;
                    fVar110 = (local_1320._16_4_ * auVar104._16_4_ + auVar14._16_4_) *
                              auVar128._0_4_;
                    local_1340._16_4_ = fVar110;
                    fVar111 = (local_1320._20_4_ * auVar104._20_4_ + auVar14._20_4_) *
                              auVar128._4_4_;
                    local_1340._20_4_ = fVar111;
                    fVar122 = (local_1320._24_4_ * auVar104._24_4_ + auVar14._24_4_) *
                              auVar128._8_4_;
                    local_1340._24_4_ = fVar122;
                    local_1340._28_4_ = auVar104._28_4_ + auVar14._28_4_;
                    auVar108 = ZEXT3264(local_1340);
                    pGVar7 = (local_16e8->geometries).items[uVar67].ptr;
                    if ((pGVar7->mask & local_1710->mask) == 0) goto LAB_00315ac4;
                    auVar171 = ZEXT3264(local_15c0);
                    if ((local_17e8->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      auVar303 = ZEXT3264(local_1600);
                      auVar275 = ZEXT3264(local_1680);
                      auVar183 = ZEXT3264(local_14e0);
                      auVar212 = ZEXT3264(_local_1540);
                      auVar235 = ZEXT3264(_local_1560);
                      auVar242 = ZEXT3264(_local_1580);
                      auVar256 = ZEXT3264(local_1500);
                      auVar261 = ZEXT3264(local_1520);
                      auVar288 = ZEXT3264(local_16a0);
                      auVar264 = ZEXT3264(local_16c0);
                      goto LAB_00315c04;
                    }
                    auVar104 = vrcpps_avx(local_1320);
                    fVar172 = auVar104._0_4_;
                    fVar184 = auVar104._4_4_;
                    auVar56._4_4_ = local_1320._4_4_ * fVar184;
                    auVar56._0_4_ = local_1320._0_4_ * fVar172;
                    fVar79 = auVar104._8_4_;
                    auVar56._8_4_ = local_1320._8_4_ * fVar79;
                    fVar90 = auVar104._12_4_;
                    auVar56._12_4_ = local_1320._12_4_ * fVar90;
                    fVar92 = auVar104._16_4_;
                    auVar56._16_4_ = local_1320._16_4_ * fVar92;
                    fVar94 = auVar104._20_4_;
                    auVar56._20_4_ = local_1320._20_4_ * fVar94;
                    fVar96 = auVar104._24_4_;
                    auVar56._24_4_ = local_1320._24_4_ * fVar96;
                    auVar56._28_4_ = auVar81._12_4_;
                    auVar152._8_4_ = 0x3f800000;
                    auVar152._0_8_ = &DAT_3f8000003f800000;
                    auVar152._12_4_ = 0x3f800000;
                    auVar152._16_4_ = 0x3f800000;
                    auVar152._20_4_ = 0x3f800000;
                    auVar152._24_4_ = 0x3f800000;
                    auVar152._28_4_ = 0x3f800000;
                    auVar153 = ZEXT3264(auVar152);
                    auVar12 = vsubps_avx(auVar152,auVar56);
                    auVar120._0_4_ = fVar172 + fVar172 * auVar12._0_4_;
                    auVar120._4_4_ = fVar184 + fVar184 * auVar12._4_4_;
                    auVar120._8_4_ = fVar79 + fVar79 * auVar12._8_4_;
                    auVar120._12_4_ = fVar90 + fVar90 * auVar12._12_4_;
                    auVar120._16_4_ = fVar92 + fVar92 * auVar12._16_4_;
                    auVar120._20_4_ = fVar94 + fVar94 * auVar12._20_4_;
                    auVar120._24_4_ = fVar96 + fVar96 * auVar12._24_4_;
                    auVar120._28_4_ = auVar104._28_4_ + auVar12._28_4_;
                    auVar135._8_4_ = 0x219392ef;
                    auVar135._0_8_ = 0x219392ef219392ef;
                    auVar135._12_4_ = 0x219392ef;
                    auVar135._16_4_ = 0x219392ef;
                    auVar135._20_4_ = 0x219392ef;
                    auVar135._24_4_ = 0x219392ef;
                    auVar135._28_4_ = 0x219392ef;
                    auVar104 = vcmpps_avx(local_1480,auVar135,5);
                    auVar136 = ZEXT3264(auVar104);
                    auVar104 = vandps_avx(auVar104,auVar120);
                    auVar121 = ZEXT3264(auVar104);
                    auVar57._4_4_ = fVar91 * auVar104._4_4_;
                    auVar57._0_4_ = fVar80 * auVar104._0_4_;
                    auVar57._8_4_ = fVar93 * auVar104._8_4_;
                    auVar57._12_4_ = fVar95 * auVar104._12_4_;
                    auVar57._16_4_ = fVar97 * auVar104._16_4_;
                    auVar57._20_4_ = fVar99 * auVar104._20_4_;
                    auVar57._24_4_ = fVar101 * auVar104._24_4_;
                    auVar57._28_4_ = fVar137;
                    local_12c0 = vminps_avx(auVar57,auVar152);
                    auVar58._4_4_ = fVar139 * auVar104._4_4_;
                    auVar58._0_4_ = fVar138 * auVar104._0_4_;
                    auVar58._8_4_ = fVar140 * auVar104._8_4_;
                    auVar58._12_4_ = fVar109 * auVar104._12_4_;
                    auVar58._16_4_ = fVar110 * auVar104._16_4_;
                    auVar58._20_4_ = fVar111 * auVar104._20_4_;
                    auVar58._24_4_ = fVar122 * auVar104._24_4_;
                    auVar58._28_4_ = local_12c0._28_4_;
                    local_12a0 = vminps_avx(auVar58,auVar152);
                    uVar59 = vmovmskps_avx(local_12e0);
                    local_17c0 = CONCAT44(0,uVar59);
                    uVar67 = 0;
                    if (CONCAT44(0,uVar59) != 0) {
                      for (; (uVar59 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
                      }
                    }
                    local_1740._0_8_ = uVar67;
                    local_15a0[0] = uVar59 != 0;
                    auVar303 = ZEXT3264(local_1600);
                    auVar275 = ZEXT3264(local_1680);
                    auVar288 = ZEXT3264(local_16a0);
                    auVar264 = ZEXT3264(local_16c0);
                    if (uVar59 != 0) {
                      local_16e0._0_8_ = local_17e8->args;
                      local_1780 = (long)pGVar7;
                      local_17a0 = (undefined1  [8])local_17e8->user;
                      local_13a0 = auVar116;
                      do {
                        local_1654 = *(undefined4 *)(local_12c0 + uVar67 * 4);
                        local_1650 = *(uint *)(local_12a0 + uVar67 * 4);
                        auVar108 = ZEXT464(local_1650);
                        local_15e0._0_4_ = ray->tfar;
                        ray->tfar = *(float *)(local_1280 + uVar67 * 4);
                        local_1660 = local_1260[uVar67];
                        auVar121 = ZEXT464((uint)local_1660);
                        local_165c = local_1240[uVar67];
                        auVar136 = ZEXT464((uint)local_165c);
                        local_1740._0_8_ = uVar67;
                        local_1658 = local_1220[uVar67];
                        auVar153 = ZEXT464((uint)local_1658);
                        local_164c = (int)local_1720;
                        local_1648 = local_1750._0_4_;
                        local_1644 = *(undefined4 *)local_17a0;
                        local_1640 = *(undefined4 *)((long)local_17a0 + 4);
                        local_17d4 = -1;
                        local_1630 = &local_17d4;
                        local_1628 = *(undefined8 *)(local_1780 + 0x18);
                        local_1620 = (undefined4 *)local_17a0;
                        local_1618 = ray;
                        local_1610 = &local_1660;
                        local_1608 = 1;
                        if (*(code **)(local_1780 + 0x48) == (code *)0x0) {
LAB_003159d0:
                          local_14c0._0_8_ = *(undefined8 *)(local_16e0._0_8_ + 0x10);
                          if ((code *)local_14c0._0_8_ == (code *)0x0) break;
                          if (((*(byte *)local_16e0._0_8_ & 2) != 0) ||
                             ((*(byte *)(local_1780 + 0x3e) & 0x40) != 0)) {
                            auVar121 = ZEXT1664(auVar121._0_16_);
                            auVar136 = ZEXT1664(auVar136._0_16_);
                            auVar153 = ZEXT1664(auVar153._0_16_);
                            (*(code *)local_14c0._0_8_)(&local_1630);
                            auVar108._8_56_ = extraout_var_00;
                            auVar108._0_8_ = extraout_XMM1_Qa_00;
                            auVar171 = ZEXT3264(local_15c0);
                            auVar264 = ZEXT3264(local_16c0);
                            auVar288 = ZEXT3264(local_16a0);
                            auVar275 = ZEXT3264(local_1680);
                            auVar303 = ZEXT3264(local_1600);
                            uVar61 = local_1818;
                            uVar68 = local_17f0;
                            uVar69 = local_17f8;
                            uVar71 = local_1800;
                            uVar72 = local_1808;
                            uVar73 = local_1810;
                          }
                          if (*local_1630 != 0) break;
                        }
                        else {
                          auVar121 = ZEXT464((uint)local_1660);
                          auVar136 = ZEXT464((uint)local_165c);
                          auVar153 = ZEXT464((uint)local_1658);
                          (**(code **)(local_1780 + 0x48))(&local_1630);
                          auVar108._8_56_ = extraout_var;
                          auVar108._0_8_ = extraout_XMM1_Qa;
                          auVar171 = ZEXT3264(local_15c0);
                          auVar264 = ZEXT3264(local_16c0);
                          auVar288 = ZEXT3264(local_16a0);
                          auVar275 = ZEXT3264(local_1680);
                          auVar303 = ZEXT3264(local_1600);
                          uVar61 = local_1818;
                          uVar68 = local_17f0;
                          uVar69 = local_17f8;
                          uVar71 = local_1800;
                          uVar72 = local_1808;
                          uVar73 = local_1810;
                          if (*local_1630 != 0) goto LAB_003159d0;
                        }
                        ray->tfar = (float)local_15e0._0_4_;
                        uVar63 = local_17c0 ^ 1L << (local_1740._0_8_ & 0x3f);
                        uVar67 = 0;
                        if (uVar63 != 0) {
                          for (; (uVar63 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
                          }
                        }
                        local_17c0 = uVar63;
                        local_15a0[0] = uVar63 != 0;
                      } while (uVar63 != 0);
                    }
                    if ((local_15a0 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                      auVar183 = ZEXT3264(local_14e0);
                      auVar212 = ZEXT3264(_local_1540);
                      auVar235 = ZEXT3264(_local_1560);
                      auVar242 = ZEXT3264(_local_1580);
                      auVar256 = ZEXT3264(local_1500);
                      auVar261 = ZEXT3264(local_1520);
                      goto LAB_00315c04;
                    }
                  }
                  local_1708 = local_1708 & local_1708 - 1;
                  pRVar65 = ray;
                } while (local_1708 != 0);
              }
              local_1700 = local_1700 + 1;
              bVar78 = local_1700 < uVar61;
              auVar183 = ZEXT3264(local_14e0);
              auVar212 = ZEXT3264(_local_1540);
              auVar235 = ZEXT3264(_local_1560);
              auVar242 = ZEXT3264(_local_1580);
              auVar256 = ZEXT3264(local_1500);
              auVar261 = ZEXT3264(local_1520);
            } while (local_1700 != uVar61);
          }
LAB_00315c04:
          iVar60 = 0;
          if (bVar78) {
            ray->tfar = -INFINITY;
            iVar60 = 3;
          }
        }
      } while (iVar60 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }